

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack8to1_int8.h
# Opt level: O0

void ncnn::im2col_sgemm_pack8to1_int8_sse(Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int iVar11;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  __m128i _w0_3;
  __m128i _w01_3;
  __m128i _val0_2;
  __m128i _val01_2;
  int j_3;
  __m128i _sum0_2;
  int nn_3;
  char *kptr0_3;
  char *tmpptr_5;
  __m128i _w0_2;
  __m128i _w01_2;
  __m128i _val1_1;
  __m128i _val0_1;
  __m128i _extval01_1;
  __m128i _val01_1;
  int j_2;
  __m128i _sum1_1;
  __m128i _sum0_1;
  int nn_2;
  char *kptr0_2;
  char *tmpptr_4;
  int i_3;
  int *outptr0_1;
  int p_1;
  int sum_1 [4];
  __m128i _tmp3_2;
  __m128i _tmp2_2;
  __m128i _tmp1_2;
  __m128i _tmp0_2;
  __m128i _w3_1;
  __m128i _w2_1;
  __m128i _w1_1;
  __m128i _w0_1;
  __m128i _extw23_1;
  __m128i _extw01_1;
  __m128i _w23_1;
  __m128i _w01_1;
  __m128i _val;
  int j_1;
  __m128i _sum3;
  __m128i _sum2;
  __m128i _sum1;
  __m128i _sum0;
  int nn_1;
  char *kptr0_1;
  char *tmpptr_3;
  int sum [8];
  __m128i _tmp3_1;
  __m128i _tmp2_1;
  __m128i _tmp1_1;
  __m128i _tmp0_1;
  __m128i _tmp3;
  __m128i _tmp2;
  __m128i _tmp1;
  __m128i _tmp0;
  __m128i _w3;
  __m128i _w2;
  __m128i _w1;
  __m128i _w0;
  __m128i _extw23;
  __m128i _extw01;
  __m128i _w23;
  __m128i _w01;
  __m128i _val1;
  __m128i _val0;
  __m128i _extval01;
  __m128i _val01;
  int j;
  __m128i _sum13;
  __m128i _sum12;
  __m128i _sum11;
  __m128i _sum10;
  __m128i _sum03;
  __m128i _sum02;
  __m128i _sum01;
  __m128i _sum00;
  int nn;
  char *kptr0;
  char *tmpptr_2;
  int i_2;
  int *outptr3;
  int *outptr2;
  int *outptr1;
  int *outptr0;
  int p;
  int pp;
  int remain_outch_start;
  int nn_outch;
  int k_1;
  int64_t *img0_1;
  int q_1;
  int64_t *tmpptr_1;
  int i_1;
  __m128i _v;
  int k;
  int64_t *img0;
  int q;
  int64_t *tmpptr;
  int i;
  int ii;
  int nn_size;
  int remain_size_start;
  Mat tmp;
  int outch;
  int inch;
  int maxk;
  int size;
  Mat *m_15;
  Mat *m_13;
  Mat *m_12;
  Mat *m_10;
  Mat *m_8;
  Mat *m_7;
  Mat *m_6;
  Mat *m_5;
  Mat *m_4;
  Mat *m_2;
  Mat *m;
  Mat *m_16;
  Mat *m_14;
  Mat *m_11;
  Mat *m_9;
  Mat *m_3;
  Mat *m_1;
  __m128i sum32_2;
  __m128i hi32_2;
  __m128i sum64_2;
  __m128i hi64_2;
  __m128i sum32_1;
  __m128i hi32_1;
  __m128i sum64_1;
  __m128i hi64_1;
  __m128i sum32;
  __m128i hi32;
  __m128i sum64;
  __m128i hi64;
  Option *in_stack_ffffffffffffd778;
  Mat *in_stack_ffffffffffffd780;
  Mat *in_stack_ffffffffffffd788;
  void **ppvVar12;
  undefined4 in_stack_ffffffffffffd790;
  int in_stack_ffffffffffffd794;
  size_t in_stack_ffffffffffffd798;
  undefined8 in_stack_ffffffffffffd7a0;
  int _c;
  undefined8 in_stack_ffffffffffffd7a8;
  undefined4 in_stack_ffffffffffffd7b0;
  undefined4 in_stack_ffffffffffffd7b4;
  Allocator *in_stack_ffffffffffffd810;
  undefined8 local_2568;
  undefined8 uStack_2560;
  undefined8 local_2548;
  undefined8 uStack_2540;
  int local_251c;
  undefined1 local_2518 [16];
  undefined8 local_24f8;
  undefined8 local_24f0;
  undefined8 local_24e8;
  undefined4 local_24e0;
  long local_24d8;
  undefined4 local_24d0;
  undefined4 local_24cc;
  undefined4 local_24c8;
  undefined4 local_24c4;
  undefined4 local_24c0;
  undefined8 local_24b8;
  ulong *local_24b0;
  undefined8 local_24a8;
  undefined8 local_24a0;
  undefined8 local_2498;
  undefined4 local_2490;
  long *local_2488;
  undefined4 local_2480;
  undefined4 local_247c;
  undefined4 local_2478;
  undefined4 local_2474;
  undefined4 local_2470;
  undefined8 local_2468;
  ulong *local_2460;
  undefined1 local_2458 [16];
  ulong local_2448;
  undefined8 uStack_2440;
  undefined1 local_2438 [16];
  undefined1 local_2428 [16];
  undefined1 local_2418 [16];
  undefined8 local_2408;
  undefined8 uStack_2400;
  int local_23ec;
  undefined1 local_23e8 [16];
  undefined1 local_23d8 [16];
  int local_23bc;
  undefined8 local_23b8;
  undefined8 local_23b0;
  undefined8 local_23a8;
  undefined4 local_23a0;
  long local_2398;
  undefined4 local_2390;
  undefined4 local_238c;
  undefined4 local_2388;
  undefined4 local_2384;
  undefined4 local_2380;
  undefined8 local_2378;
  ulong *local_2370;
  undefined8 local_2368;
  undefined8 local_2360;
  undefined8 local_2358;
  undefined4 local_2350;
  long *local_2348;
  undefined4 local_2340;
  undefined4 local_233c;
  undefined4 local_2338;
  undefined4 local_2334;
  undefined4 local_2330;
  undefined8 local_2328;
  undefined1 (*local_2320) [16];
  int local_2314;
  undefined8 local_2310;
  undefined8 local_2308;
  undefined8 local_2300;
  undefined4 local_22f8;
  long local_22f0;
  undefined4 local_22e8;
  undefined4 local_22e4;
  undefined4 local_22e0;
  undefined4 local_22dc;
  undefined4 local_22d8;
  undefined8 local_22d0;
  undefined4 *local_22c8;
  int local_22bc;
  undefined4 local_22b8;
  undefined4 uStack_22b4;
  undefined4 uStack_22b0;
  undefined4 uStack_22ac;
  undefined1 local_22a8 [16];
  undefined1 local_2298 [16];
  undefined1 local_2288 [16];
  undefined1 local_2278 [16];
  undefined1 local_2268 [16];
  undefined1 local_2258 [16];
  undefined1 local_2248 [16];
  undefined1 local_2238 [16];
  undefined1 local_2228 [16];
  undefined1 local_2218 [16];
  undefined8 local_2208;
  undefined8 uStack_2200;
  undefined8 local_21f8;
  undefined8 uStack_21f0;
  undefined1 local_21e8 [16];
  int local_21cc;
  undefined1 local_21c8 [16];
  undefined1 local_21b8 [16];
  undefined1 local_21a8 [16];
  undefined1 local_2198 [16];
  int local_217c;
  undefined8 local_2178;
  undefined8 local_2170;
  undefined8 local_2168;
  undefined4 local_2160;
  long local_2158;
  undefined4 local_2150;
  undefined4 local_214c;
  undefined4 local_2148;
  undefined4 local_2144;
  undefined4 local_2140;
  undefined8 local_2138;
  undefined1 (*local_2130) [16];
  undefined8 local_2128;
  undefined8 local_2120;
  undefined8 local_2118;
  undefined4 local_2110;
  long *local_2108;
  undefined4 local_2100;
  undefined4 local_20fc;
  undefined4 local_20f8;
  undefined4 local_20f4;
  undefined4 local_20f0;
  undefined8 local_20e8;
  ulong *local_20e0;
  undefined4 local_20d8;
  undefined4 uStack_20d4;
  undefined4 uStack_20d0;
  undefined4 uStack_20cc;
  undefined4 local_20c8;
  undefined4 uStack_20c4;
  undefined4 uStack_20c0;
  undefined4 uStack_20bc;
  undefined1 local_20b8 [16];
  undefined1 local_20a8 [16];
  undefined1 local_2098 [16];
  undefined1 local_2088 [16];
  undefined1 local_2078 [16];
  undefined1 local_2068 [16];
  undefined1 local_2058 [16];
  undefined1 local_2048 [16];
  undefined1 local_2038 [16];
  undefined1 local_2028 [16];
  undefined1 local_2018 [16];
  undefined1 local_2008 [16];
  undefined1 local_1ff8 [16];
  undefined1 local_1fe8 [16];
  undefined8 local_1fd8;
  undefined8 uStack_1fd0;
  undefined8 local_1fc8;
  undefined8 uStack_1fc0;
  undefined1 local_1fb8 [16];
  undefined1 local_1fa8 [16];
  undefined1 local_1f98 [16];
  undefined8 local_1f88;
  undefined8 uStack_1f80;
  int local_1f6c;
  undefined1 local_1f68 [16];
  undefined1 local_1f58 [16];
  undefined1 local_1f48 [16];
  undefined1 local_1f38 [16];
  undefined1 local_1f28 [16];
  undefined1 local_1f18 [16];
  undefined1 local_1f08 [16];
  undefined1 local_1ef8 [16];
  int local_1edc;
  undefined8 local_1ed8;
  undefined8 local_1ed0;
  undefined8 local_1ec8;
  undefined4 local_1ec0;
  long local_1eb8;
  undefined4 local_1eb0;
  undefined4 local_1eac;
  undefined4 local_1ea8;
  undefined4 local_1ea4;
  undefined4 local_1ea0;
  undefined8 local_1e98;
  undefined1 (*local_1e90) [16];
  undefined8 local_1e88;
  undefined8 local_1e80;
  undefined8 local_1e78;
  undefined4 local_1e70;
  long *local_1e68;
  undefined4 local_1e60;
  undefined4 local_1e5c;
  undefined4 local_1e58;
  undefined4 local_1e54;
  undefined4 local_1e50;
  undefined8 local_1e48;
  undefined1 (*local_1e40) [16];
  int local_1e34;
  undefined8 local_1e30;
  undefined8 local_1e28;
  undefined8 local_1e20;
  undefined4 local_1e18;
  long local_1e10;
  undefined4 local_1e08;
  undefined4 local_1e04;
  undefined4 local_1e00;
  undefined4 local_1dfc;
  undefined4 local_1df8;
  undefined8 local_1df0;
  undefined4 *local_1de8;
  undefined8 local_1de0;
  undefined8 local_1dd8;
  undefined8 local_1dd0;
  undefined4 local_1dc8;
  long local_1dc0;
  undefined4 local_1db8;
  undefined4 local_1db4;
  undefined4 local_1db0;
  undefined4 local_1dac;
  undefined4 local_1da8;
  undefined8 local_1da0;
  undefined4 *local_1d98;
  undefined8 local_1d90;
  undefined8 local_1d88;
  undefined8 local_1d80;
  undefined4 local_1d78;
  long local_1d70;
  undefined4 local_1d68;
  undefined4 local_1d64;
  undefined4 local_1d60;
  undefined4 local_1d5c;
  undefined4 local_1d58;
  undefined8 local_1d50;
  undefined4 *local_1d48;
  undefined8 local_1d40;
  undefined8 local_1d38;
  undefined8 local_1d30;
  undefined4 local_1d28;
  long local_1d20;
  undefined4 local_1d18;
  undefined4 local_1d14;
  undefined4 local_1d10;
  undefined4 local_1d0c;
  undefined4 local_1d08;
  undefined8 local_1d00;
  undefined4 *local_1cf8;
  int local_1cec;
  int local_1ce8;
  int local_1ce4;
  int local_1ce0;
  int local_1cdc;
  undefined8 local_1cd8;
  undefined8 local_1cd0;
  undefined8 local_1cc8;
  undefined4 local_1cc0;
  long local_1cb8;
  undefined4 local_1cb0;
  undefined4 local_1cac;
  undefined4 local_1ca8;
  undefined4 local_1ca4;
  undefined4 local_1ca0;
  undefined8 local_1c98;
  undefined8 *local_1c90;
  int local_1c84;
  undefined8 local_1c80;
  undefined8 local_1c78;
  undefined8 local_1c70;
  undefined4 local_1c68;
  long *local_1c60;
  undefined4 local_1c58;
  undefined4 local_1c54;
  undefined4 local_1c50;
  undefined4 local_1c4c;
  undefined4 local_1c48;
  undefined8 local_1c40;
  undefined8 *local_1c38;
  int local_1c2c;
  undefined8 local_1c28;
  undefined8 uStack_1c20;
  int local_1c14;
  undefined8 local_1c10;
  undefined8 local_1c08;
  undefined8 local_1c00;
  undefined4 local_1bf8;
  long local_1bf0;
  undefined4 local_1be8;
  undefined4 local_1be4;
  undefined4 local_1be0;
  undefined4 local_1bdc;
  undefined4 local_1bd8;
  undefined8 local_1bd0;
  undefined8 *local_1bc8;
  int local_1bbc;
  undefined8 local_1bb8;
  undefined8 local_1bb0;
  undefined8 local_1ba8;
  undefined4 local_1ba0;
  long *local_1b98;
  undefined4 local_1b90;
  undefined4 local_1b8c;
  undefined4 local_1b88;
  undefined4 local_1b84;
  undefined4 local_1b80;
  undefined8 local_1b78;
  undefined8 *local_1b70;
  int local_1b64;
  int local_1b60;
  int local_1b5c;
  int local_1b58;
  void *local_1b48;
  int *local_1b40;
  long local_1b38;
  undefined4 local_1b30;
  long *local_1b28;
  undefined4 local_1b20;
  int local_1b1c;
  int local_1b18;
  undefined4 local_1b14;
  undefined4 local_1b10;
  long local_1b08;
  int local_1b00;
  int local_1afc;
  int local_1af8;
  int local_1af4;
  long *local_1ae8;
  long *local_1ae0;
  long *local_1ad8;
  void **local_1ad0;
  undefined8 *local_1ac8;
  undefined8 *local_1ac0;
  undefined8 *local_1ab8;
  undefined8 *local_1ab0;
  undefined8 *local_1aa8;
  undefined8 *local_1aa0;
  undefined8 *local_1a98;
  undefined8 *local_1a90;
  undefined8 *local_1a88;
  undefined8 *local_1a80;
  undefined8 *local_1a78;
  undefined8 *local_1a70;
  undefined8 *local_1a68;
  undefined8 *local_1a60;
  undefined8 *local_1a58;
  undefined8 *local_1a50;
  undefined8 *local_1a48;
  void **local_1a40;
  int local_1a20;
  undefined4 local_1a1c;
  void **local_1a18;
  undefined8 *local_1a08;
  undefined8 *local_19f8;
  undefined8 *local_19e8;
  undefined8 *local_19d8;
  undefined8 *local_19c8;
  undefined8 *local_19b8;
  undefined8 *local_19a8;
  undefined8 *local_1998;
  undefined8 *local_1988;
  undefined8 *local_1978;
  undefined8 *local_1968;
  undefined8 *local_1958;
  undefined8 *local_1948;
  undefined8 *local_1938;
  undefined8 *local_1928;
  undefined8 *local_1918;
  undefined8 *local_1908;
  undefined1 local_18fd;
  int local_18fc;
  void **local_18f8;
  undefined8 *local_18f0;
  undefined1 local_18cd;
  int local_18cc;
  void **local_18c8;
  undefined8 *local_18c0;
  undefined1 local_189d;
  int local_189c;
  undefined8 *local_1890;
  undefined1 local_186d;
  int local_186c;
  void **local_1868;
  undefined8 *local_1860;
  undefined1 local_183d;
  int local_183c;
  void **local_1838;
  undefined8 *local_1830;
  undefined1 local_180d;
  int local_180c;
  undefined8 *local_1800;
  undefined1 local_17dd;
  int local_17dc;
  undefined8 *local_17d0;
  undefined1 local_17ad;
  int local_17ac;
  undefined8 *local_17a0;
  undefined1 local_177d;
  int local_177c;
  undefined8 *local_1770;
  undefined1 local_174d;
  int local_174c;
  void **local_1748;
  undefined8 *local_1740;
  undefined1 local_171d;
  int local_171c;
  void **local_1718;
  undefined8 *local_1710;
  undefined1 local_16ed;
  int local_16ec;
  undefined8 *local_16e0;
  undefined1 local_16bd;
  int local_16bc;
  undefined8 *local_16b0;
  undefined1 local_168d;
  int local_168c;
  undefined8 *local_1680;
  undefined1 local_165d;
  int local_165c;
  undefined8 *local_1650;
  undefined1 local_162d;
  int local_162c;
  undefined8 *local_1620;
  undefined1 local_15fd;
  int local_15fc;
  undefined8 *local_15f0;
  void *local_14c0;
  long local_14b0;
  undefined4 local_14a4;
  long local_14a0;
  long local_1498;
  undefined4 local_148c;
  int local_1488;
  int local_1484;
  undefined8 *local_1480;
  long local_1478;
  undefined4 local_146c;
  long local_1468;
  long local_1460;
  undefined4 local_1454;
  int local_1450;
  int local_144c;
  undefined8 *local_1448;
  long local_1440;
  undefined4 local_1434;
  long local_1430;
  undefined1 (*local_1428) [16];
  undefined4 local_141c;
  int local_1418;
  int local_1414;
  undefined8 *local_1410;
  long local_1408;
  undefined4 local_13fc;
  long local_13f8;
  undefined1 (*local_13f0) [16];
  undefined4 local_13e4;
  int local_13e0;
  int local_13dc;
  undefined8 *local_13d8;
  long local_13d0;
  undefined4 local_13c4;
  long local_13c0;
  ulong *local_13b8;
  undefined4 local_13ac;
  int local_13a8;
  int local_13a4;
  undefined8 *local_13a0;
  long local_1398;
  undefined4 local_138c;
  long local_1388;
  ulong *local_1380;
  undefined4 local_1374;
  int local_1370;
  int local_136c;
  undefined8 *local_1368;
  long *local_1360;
  undefined4 local_1354;
  long local_1350;
  undefined8 *local_1348;
  undefined4 local_133c;
  int local_1338;
  int local_1334;
  undefined8 *local_1330;
  long *local_1328;
  undefined4 local_131c;
  long local_1318;
  undefined8 *local_1310;
  undefined4 local_1304;
  int local_1300;
  int local_12fc;
  undefined8 *local_12f8;
  long local_12f0;
  undefined4 local_12e4;
  long local_12e0;
  undefined4 *local_12d8;
  undefined4 local_12cc;
  int local_12c8;
  int local_12c4;
  undefined8 *local_12c0;
  long local_12b8;
  undefined4 local_12ac;
  long local_12a8;
  undefined4 *local_12a0;
  undefined4 local_1294;
  int local_1290;
  int local_128c;
  undefined8 *local_1288;
  long local_1280;
  undefined4 local_1274;
  long local_1270;
  undefined4 *local_1268;
  undefined4 local_125c;
  int local_1258;
  int local_1254;
  undefined8 *local_1250;
  long local_1248;
  undefined4 local_123c;
  long local_1238;
  undefined4 *local_1230;
  undefined4 local_1224;
  int local_1220;
  int local_121c;
  undefined8 *local_1218;
  long *local_1210;
  undefined4 local_1204;
  long local_1200;
  undefined1 (*local_11f8) [16];
  undefined4 local_11ec;
  int local_11e8;
  int local_11e4;
  undefined8 *local_11e0;
  long *local_11d8;
  undefined4 local_11cc;
  long local_11c8;
  ulong *local_11c0;
  undefined4 local_11b4;
  int local_11b0;
  int local_11ac;
  undefined8 *local_11a8;
  long local_11a0;
  undefined4 local_1194;
  long local_1190;
  undefined4 *local_1188;
  undefined4 local_117c;
  int local_1178;
  int local_1174;
  undefined8 *local_1170;
  long *local_1168;
  undefined4 local_115c;
  long local_1158;
  undefined1 (*local_1150) [16];
  undefined4 local_1144;
  int local_1140;
  int local_113c;
  undefined8 *local_1138;
  long *local_1130;
  undefined4 local_1124;
  long local_1120;
  ulong *local_1118;
  undefined4 local_110c;
  int local_1108;
  int local_1104;
  undefined8 *local_1100;
  undefined4 local_10f4;
  long local_10f0;
  undefined4 local_10e4;
  long local_10e0;
  undefined4 local_10d4;
  long local_10d0;
  undefined4 local_10c4;
  long local_10c0;
  undefined4 local_10b4;
  long local_10b0;
  undefined4 local_10a4;
  long local_10a0;
  undefined4 local_1094;
  long local_1090;
  undefined4 local_1084;
  long local_1080;
  undefined4 local_1074;
  long local_1070;
  undefined4 local_1064;
  long local_1060;
  undefined4 local_1054;
  long local_1050;
  undefined4 local_1044;
  long local_1040;
  undefined4 local_1034;
  long local_1030;
  undefined4 local_1024;
  long local_1020;
  undefined4 local_1014;
  long local_1010;
  undefined4 local_1004;
  long local_1000;
  undefined4 local_ff4;
  long local_ff0;
  undefined8 local_fe8;
  undefined8 uStack_fe0;
  undefined1 local_fd8 [16];
  undefined8 local_fc8;
  undefined8 uStack_fc0;
  undefined1 local_fb8 [16];
  undefined8 local_fa8;
  undefined8 uStack_fa0;
  undefined1 local_f98 [16];
  undefined8 local_f88;
  undefined8 uStack_f80;
  undefined8 local_f78;
  undefined8 uStack_f70;
  undefined8 local_f68;
  undefined8 uStack_f60;
  undefined8 local_f58;
  undefined8 uStack_f50;
  undefined8 local_f48;
  undefined8 uStack_f40;
  undefined8 local_f38;
  undefined8 uStack_f30;
  undefined8 local_f28;
  undefined8 uStack_f20;
  undefined1 local_f18 [16];
  undefined8 local_f08;
  undefined8 uStack_f00;
  undefined1 local_ef8 [16];
  undefined8 local_ee8;
  undefined8 uStack_ee0;
  undefined1 local_ed8 [16];
  undefined8 local_ec8;
  undefined8 uStack_ec0;
  undefined1 local_eb8 [16];
  undefined8 local_ea8;
  undefined8 uStack_ea0;
  undefined8 local_e98;
  undefined8 uStack_e90;
  undefined8 local_e88;
  undefined8 uStack_e80;
  undefined8 local_e78;
  undefined8 uStack_e70;
  undefined8 local_e68;
  undefined8 uStack_e60;
  undefined8 local_e58;
  undefined8 uStack_e50;
  undefined8 local_e48;
  undefined8 uStack_e40;
  undefined8 local_e38;
  undefined8 uStack_e30;
  undefined8 local_e28;
  undefined8 uStack_e20;
  undefined8 local_e18;
  undefined8 uStack_e10;
  undefined8 local_e08;
  undefined8 uStack_e00;
  undefined8 local_df8;
  undefined8 uStack_df0;
  undefined8 local_de8;
  undefined8 uStack_de0;
  undefined1 local_dd8 [16];
  undefined8 local_dc8;
  undefined8 uStack_dc0;
  undefined1 local_db8 [16];
  undefined8 local_da8;
  undefined8 uStack_da0;
  undefined1 local_d98 [16];
  undefined8 local_d88;
  undefined8 uStack_d80;
  undefined1 local_d78 [16];
  undefined8 local_d68;
  undefined8 uStack_d60;
  undefined1 local_d58 [16];
  undefined8 local_d48;
  undefined8 uStack_d40;
  undefined1 local_d38 [16];
  undefined8 local_d28;
  undefined8 uStack_d20;
  undefined1 local_d18 [16];
  undefined8 local_d08;
  undefined8 uStack_d00;
  undefined1 local_cf8 [16];
  undefined8 *local_ce0;
  undefined8 *local_cd8;
  undefined8 *local_cd0;
  undefined8 *local_cc8;
  undefined8 *local_cc0;
  undefined8 *local_cb8;
  undefined8 *local_cb0;
  undefined8 *local_ca8;
  undefined1 (*local_ca0) [16];
  undefined1 (*local_c98) [16];
  undefined1 (*local_c90) [16];
  undefined1 (*local_c88) [16];
  undefined1 (*local_c80) [16];
  undefined1 (*local_c78) [16];
  undefined8 *local_c70;
  undefined8 local_c68;
  undefined8 uStack_c60;
  undefined4 *local_c50;
  undefined8 local_c48;
  undefined8 uStack_c40;
  undefined4 *local_c30;
  undefined8 local_c28;
  undefined8 uStack_c20;
  undefined4 *local_c10;
  undefined8 local_c08;
  undefined8 uStack_c00;
  undefined8 *local_bf8;
  undefined8 *local_bf0;
  undefined8 *local_be8;
  undefined8 *local_be0;
  undefined8 *local_bd8;
  undefined8 *local_bd0;
  undefined8 *local_bc8;
  undefined8 *local_bc0;
  undefined8 *local_bb8;
  undefined8 *local_bb0;
  undefined8 local_ba8;
  undefined8 uStack_ba0;
  undefined1 local_b98 [16];
  undefined8 local_b88;
  undefined8 uStack_b80;
  undefined8 local_b78;
  undefined8 uStack_b70;
  undefined1 local_b68 [16];
  undefined1 local_b58 [16];
  undefined8 local_b48;
  undefined8 uStack_b40;
  undefined8 local_b38;
  undefined8 uStack_b30;
  undefined8 local_b28;
  undefined8 uStack_b20;
  undefined8 local_b18;
  undefined8 uStack_b10;
  undefined1 local_b08 [16];
  undefined1 local_af8 [16];
  undefined1 local_ae8 [16];
  undefined8 local_ad8;
  undefined8 uStack_ad0;
  undefined8 local_ac8;
  undefined8 uStack_ac0;
  undefined8 local_ab8;
  undefined8 uStack_ab0;
  undefined8 local_aa8;
  undefined8 uStack_aa0;
  undefined8 local_a98;
  undefined8 uStack_a90;
  undefined8 local_a88;
  undefined8 uStack_a80;
  undefined8 local_a78;
  undefined8 uStack_a70;
  undefined8 local_a68;
  undefined8 uStack_a60;
  undefined8 local_a58;
  undefined8 uStack_a50;
  undefined8 local_a48;
  ulong uStack_a40;
  undefined8 local_a38;
  undefined8 uStack_a30;
  undefined8 local_a28;
  ulong uStack_a20;
  undefined8 local_a18;
  undefined8 uStack_a10;
  undefined8 local_a08;
  ulong uStack_a00;
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  undefined8 local_9e8;
  ulong uStack_9e0;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  undefined8 local_9c8;
  ulong uStack_9c0;
  undefined8 local_9b8;
  undefined8 uStack_9b0;
  undefined8 local_9a8;
  ulong uStack_9a0;
  undefined8 local_998;
  undefined8 uStack_990;
  undefined8 local_988;
  undefined8 uStack_980;
  undefined8 local_978;
  undefined8 uStack_970;
  undefined8 local_968;
  undefined8 uStack_960;
  undefined8 local_958;
  undefined8 uStack_950;
  undefined8 local_948;
  undefined8 uStack_940;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 local_928;
  undefined8 uStack_920;
  undefined8 local_918;
  undefined8 uStack_910;
  undefined8 local_908;
  undefined8 uStack_900;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  undefined8 local_888;
  undefined8 uStack_880;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined8 local_868;
  undefined8 uStack_860;
  undefined8 local_858;
  undefined8 uStack_850;
  undefined8 local_848;
  undefined8 uStack_840;
  undefined8 local_838;
  undefined8 uStack_830;
  undefined8 local_828;
  undefined8 uStack_820;
  undefined8 local_818;
  undefined8 uStack_810;
  undefined8 local_808;
  undefined8 uStack_800;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_788;
  undefined8 uStack_780;
  undefined8 local_778;
  undefined8 uStack_770;
  undefined8 local_768;
  undefined8 uStack_760;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined8 local_748;
  undefined8 uStack_740;
  undefined8 local_738;
  undefined8 uStack_730;
  undefined8 local_728;
  undefined8 uStack_720;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined8 local_708;
  undefined8 uStack_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 local_698;
  undefined8 uStack_690;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined8 local_658;
  undefined8 uStack_650;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  ulong local_338;
  undefined8 uStack_330;
  ulong *local_320;
  ulong local_318;
  undefined8 uStack_310;
  ulong *local_300;
  ulong local_2f8;
  undefined8 uStack_2f0;
  ulong *local_2e0;
  ulong local_2d8;
  undefined8 uStack_2d0;
  ulong *local_2c0;
  ulong local_2b8;
  undefined8 uStack_2b0;
  ulong local_2a8;
  undefined8 uStack_2a0;
  ulong local_298;
  undefined8 uStack_290;
  ulong local_288;
  undefined8 uStack_280;
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  _c = (int)((ulong)in_stack_ffffffffffffd7a0 >> 0x20);
  local_1ae8 = in_RDX;
  local_1ae0 = in_RSI;
  local_1ad8 = in_RDI;
  iVar11 = cpu_support_x86_avx2();
  if (iVar11 == 0) {
    iVar11 = cpu_support_x86_xop();
    if (iVar11 == 0) {
      local_1af4 = *(int *)((long)local_1ad8 + 0x2c);
      local_1af8 = (int)local_1ad8[6];
      local_1afc = (int)local_1ad8[7];
      local_1b00 = (int)local_1ae0[7];
      local_1ad0 = &local_1b48;
      local_1b48 = (void *)0x0;
      local_1b40 = (int *)0x0;
      local_1b38 = 0;
      local_1b30 = 0;
      local_1b28 = (long *)0x0;
      local_1b20 = 0;
      local_1b1c = 0;
      local_1b18 = 0;
      local_1b14 = 0;
      local_1b10 = 0;
      local_1b08 = 0;
      iVar11 = (int)((ulong)in_stack_ffffffffffffd7a8 >> 0x20);
      if (local_1af4 < 2) {
        Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffd7b4,in_stack_ffffffffffffd7b0),iVar11,
                    (int)in_stack_ffffffffffffd7a8,_c,in_stack_ffffffffffffd798,
                    in_stack_ffffffffffffd794,in_stack_ffffffffffffd810);
      }
      else {
        Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffd7b4,in_stack_ffffffffffffd7b0),iVar11,
                    (int)in_stack_ffffffffffffd7a8,_c,in_stack_ffffffffffffd798,
                    in_stack_ffffffffffffd794,in_stack_ffffffffffffd810);
      }
      local_1b5c = local_1af4 >> 1;
      for (local_1b60 = 0; local_1b60 < local_1b5c; local_1b60 = local_1b60 + 1) {
        local_1b64 = local_1b60 * 2;
        local_171c = local_1b64 / 2;
        local_1710 = &local_1bb8;
        local_1718 = &local_1b48;
        local_1348 = (undefined8 *)((long)local_1b48 + local_1b08 * local_171c * local_1b38);
        local_1330 = &local_1bb8;
        local_1050 = (long)local_1b1c * (long)local_1b18 * local_1b38;
        local_cb8 = &local_1bb8;
        local_1ac8 = &local_1bb8;
        local_1b98 = local_1b28;
        local_1054 = 0x10;
        local_1334 = local_1b1c;
        local_1338 = local_1b18;
        local_133c = local_1b14;
        local_1350 = local_1b38;
        local_1354 = local_1b30;
        local_1360 = local_1b28;
        local_171d = 1;
        local_1bb8 = 0;
        local_1ba8 = 0;
        local_1ba0 = 0;
        local_1b90 = 0;
        local_1b8c = 0;
        local_1b88 = 0;
        local_1b84 = 0;
        local_1b80 = 0;
        local_1b78 = 0;
        local_1bb0 = 0;
        local_1b70 = local_1348;
        for (local_1bbc = 0; local_1bbc < local_1afc; local_1bbc = local_1bbc + 1) {
          local_15f0 = &local_1c10;
          local_1484 = *(int *)((long)local_1ad8 + 0x2c);
          local_1488 = (int)local_1ad8[6];
          local_148c = *(undefined4 *)((long)local_1ad8 + 0x34);
          local_1498 = *local_1ad8 + local_1ad8[8] * (long)local_1bbc * local_1ad8[2];
          local_14a0 = local_1ad8[2];
          local_14a4 = (undefined4)local_1ad8[3];
          local_14b0 = local_1ad8[4];
          local_1480 = &local_1c10;
          local_ff0 = (long)local_1484 * (long)local_1488 * local_14a0;
          local_ca8 = &local_1c10;
          local_1bc8 = (undefined8 *)(local_1498 + (long)local_1b64 * 8);
          local_1ac0 = &local_1c10;
          local_ff4 = 0x10;
          local_15fc = local_1bbc;
          local_15fd = 1;
          local_1c10 = 0;
          local_1c00 = 0;
          local_1bf8 = 0;
          local_1be8 = 0;
          local_1be4 = 0;
          local_1be0 = 0;
          local_1bdc = 0;
          local_1bd8 = 0;
          local_1bd0 = 0;
          local_1c08 = 0;
          for (local_1c14 = 0; local_1c14 < local_1af8; local_1c14 = local_1c14 + 1) {
            local_c70 = local_1bc8;
            local_1c28 = *local_1bc8;
            uStack_1c20 = local_1bc8[1];
            local_bf8 = local_1b70;
            *local_1b70 = local_1c28;
            local_1b70[1] = uStack_1c20;
            local_1b70 = local_1b70 + 2;
            local_1bc8 = local_1bc8 + local_1af4;
            local_c08 = local_1c28;
            uStack_c00 = uStack_1c20;
          }
          local_1918 = local_1ac0;
          local_1bf0 = local_14b0;
        }
        local_1908 = local_1ac8;
      }
      local_1b58 = local_1b5c * 2;
      for (local_1c2c = local_1b58; local_1c2c < local_1af4; local_1c2c = local_1c2c + 1) {
        local_174c = local_1c2c / 2 + local_1c2c % 2;
        local_1740 = &local_1c80;
        local_1748 = &local_1b48;
        local_1310 = (undefined8 *)((long)local_1b48 + local_1b08 * local_174c * local_1b38);
        local_12f8 = &local_1c80;
        local_1060 = (long)local_1b1c * (long)local_1b18 * local_1b38;
        local_cc0 = &local_1c80;
        local_1ab8 = &local_1c80;
        local_1c60 = local_1b28;
        local_1064 = 0x10;
        local_12fc = local_1b1c;
        local_1300 = local_1b18;
        local_1304 = local_1b14;
        local_1318 = local_1b38;
        local_131c = local_1b30;
        local_1328 = local_1b28;
        local_174d = 1;
        local_1c80 = 0;
        local_1c70 = 0;
        local_1c68 = 0;
        local_1c58 = 0;
        local_1c54 = 0;
        local_1c50 = 0;
        local_1c4c = 0;
        local_1c48 = 0;
        local_1c40 = 0;
        local_1c78 = 0;
        local_1c38 = local_1310;
        for (local_1c84 = 0; local_1c84 < local_1afc; local_1c84 = local_1c84 + 1) {
          local_1620 = &local_1cd8;
          local_144c = *(int *)((long)local_1ad8 + 0x2c);
          local_1450 = (int)local_1ad8[6];
          local_1454 = *(undefined4 *)((long)local_1ad8 + 0x34);
          local_1460 = *local_1ad8 + local_1ad8[8] * (long)local_1c84 * local_1ad8[2];
          local_1468 = local_1ad8[2];
          local_146c = (undefined4)local_1ad8[3];
          local_1478 = local_1ad8[4];
          local_1448 = &local_1cd8;
          local_1000 = (long)local_144c * (long)local_1450 * local_1468;
          local_cb0 = &local_1cd8;
          local_1c90 = (undefined8 *)(local_1460 + (long)local_1c2c * 8);
          local_1ab0 = &local_1cd8;
          local_1004 = 0x10;
          local_162c = local_1c84;
          local_162d = 1;
          local_1cd8 = 0;
          local_1cc8 = 0;
          local_1cc0 = 0;
          local_1cb0 = 0;
          local_1cac = 0;
          local_1ca8 = 0;
          local_1ca4 = 0;
          local_1ca0 = 0;
          local_1c98 = 0;
          local_1cd0 = 0;
          for (local_1cdc = 0; local_1cdc < local_1af8; local_1cdc = local_1cdc + 1) {
            *local_1c38 = *local_1c90;
            local_1c38 = local_1c38 + 1;
            local_1c90 = local_1c90 + local_1af4;
          }
          local_1938 = local_1ab0;
          local_1cb8 = local_1478;
        }
        local_1928 = local_1ab8;
      }
      local_1ce0 = local_1b00 >> 2;
      for (local_1ce8 = 0; local_1ce8 < local_1ce0; local_1ce8 = local_1ce8 + 1) {
        local_1cec = local_1ce8 * 4;
        local_1770 = &local_1d40;
        local_12c4 = *(int *)((long)local_1ae0 + 0x2c);
        local_12c8 = (int)local_1ae0[6];
        local_12cc = *(undefined4 *)((long)local_1ae0 + 0x34);
        local_12d8 = (undefined4 *)(*local_1ae0 + local_1ae0[8] * (long)local_1cec * local_1ae0[2]);
        local_12e0 = local_1ae0[2];
        local_12e4 = (undefined4)local_1ae0[3];
        local_12f0 = local_1ae0[4];
        local_12c0 = &local_1d40;
        local_1070 = (long)local_12c4 * (long)local_12c8 * local_12e0;
        local_bd0 = &local_1d40;
        local_1aa8 = &local_1d40;
        local_17ac = local_1cec + 1;
        local_17a0 = &local_1d90;
        local_128c = *(int *)((long)local_1ae0 + 0x2c);
        local_1290 = (int)local_1ae0[6];
        local_1294 = *(undefined4 *)((long)local_1ae0 + 0x34);
        local_12a0 = (undefined4 *)(*local_1ae0 + local_1ae0[8] * (long)local_17ac * local_1ae0[2]);
        local_12a8 = local_1ae0[2];
        local_12ac = (undefined4)local_1ae0[3];
        local_12b8 = local_1ae0[4];
        local_1288 = &local_1d90;
        local_1080 = (long)local_128c * (long)local_1290 * local_12a8;
        local_bd8 = &local_1d90;
        local_1aa0 = &local_1d90;
        local_17dc = local_1cec + 2;
        local_17d0 = &local_1de0;
        local_1254 = *(int *)((long)local_1ae0 + 0x2c);
        local_1258 = (int)local_1ae0[6];
        local_125c = *(undefined4 *)((long)local_1ae0 + 0x34);
        local_1268 = (undefined4 *)(*local_1ae0 + local_1ae0[8] * (long)local_17dc * local_1ae0[2]);
        local_1270 = local_1ae0[2];
        local_1274 = (undefined4)local_1ae0[3];
        local_1280 = local_1ae0[4];
        local_1250 = &local_1de0;
        local_1090 = (long)local_1254 * (long)local_1258 * local_1270;
        local_be0 = &local_1de0;
        local_1a98 = &local_1de0;
        local_180c = local_1cec + 3;
        local_1800 = &local_1e30;
        local_121c = *(int *)((long)local_1ae0 + 0x2c);
        local_1220 = (int)local_1ae0[6];
        local_1224 = *(undefined4 *)((long)local_1ae0 + 0x34);
        local_1230 = (undefined4 *)(*local_1ae0 + local_1ae0[8] * (long)local_180c * local_1ae0[2]);
        local_1238 = local_1ae0[2];
        local_123c = (undefined4)local_1ae0[3];
        local_1248 = local_1ae0[4];
        local_1218 = &local_1e30;
        local_10a0 = (long)local_121c * (long)local_1220 * local_1238;
        local_be8 = &local_1e30;
        local_1a90 = &local_1e30;
        local_1d08 = 0;
        local_1d0c = 0;
        local_1d10 = 0;
        local_1d14 = 0;
        local_1d28 = 0;
        local_1d30 = 0;
        local_1d38 = 0;
        local_1d40 = 0;
        local_1d58 = 0;
        local_1d5c = 0;
        local_1d60 = 0;
        local_1d64 = 0;
        local_1d78 = 0;
        local_1d80 = 0;
        local_1d88 = 0;
        local_1d90 = 0;
        local_1da8 = 0;
        local_1dac = 0;
        local_1db0 = 0;
        local_1db4 = 0;
        local_1dc8 = 0;
        local_1dd0 = 0;
        local_1dd8 = 0;
        local_1de0 = 0;
        local_1074 = 0x10;
        local_1084 = 0x10;
        local_1094 = 0x10;
        local_10a4 = 0x10;
        local_177d = 1;
        local_17ad = 1;
        local_17dd = 1;
        local_180d = 1;
        local_1d00 = 0;
        local_1d18 = 0;
        local_1d50 = 0;
        local_1d68 = 0;
        local_1da0 = 0;
        local_1db8 = 0;
        local_1e30 = 0;
        local_1e20 = 0;
        local_1e18 = 0;
        local_1e08 = 0;
        local_1e04 = 0;
        local_1e00 = 0;
        local_1dfc = 0;
        local_1df8 = 0;
        local_1df0 = 0;
        local_1e28 = 0;
        local_1de8 = local_1230;
        local_1d98 = local_1268;
        local_1d48 = local_12a0;
        local_1cf8 = local_12d8;
        for (local_1e34 = 0; local_1e34 + 1 < local_1af4; local_1e34 = local_1e34 + 2) {
          local_183c = local_1e34 / 2;
          local_1830 = &local_1e88;
          local_1838 = &local_1b48;
          local_11f8 = (undefined1 (*) [16])
                       ((long)local_1b48 + local_1b08 * local_183c * local_1b38);
          local_11e0 = &local_1e88;
          local_10b0 = (long)local_1b1c * (long)local_1b18 * local_1b38;
          local_bb0 = &local_1e88;
          local_1a88 = &local_1e88;
          local_165c = local_1cec / 4;
          local_1650 = &local_1ed8;
          local_1414 = *(int *)((long)local_1ae8 + 0x2c);
          local_1418 = (int)local_1ae8[6];
          local_141c = *(undefined4 *)((long)local_1ae8 + 0x34);
          local_1428 = (undefined1 (*) [16])
                       (*local_1ae8 + local_1ae8[8] * (long)local_165c * local_1ae8[2]);
          local_1430 = local_1ae8[2];
          local_1434 = (undefined4)local_1ae8[3];
          local_1440 = local_1ae8[4];
          local_1410 = &local_1ed8;
          local_1010 = (long)local_1414 * (long)local_1418 * local_1430;
          local_cc8 = &local_1ed8;
          local_1a80 = &local_1ed8;
          local_1e50 = 0;
          local_1e54 = 0;
          local_1e58 = 0;
          local_1e5c = 0;
          local_1e68 = local_1b28;
          local_1e70 = 0;
          local_1e78 = 0;
          local_1e80 = 0;
          local_1e88 = 0;
          local_1014 = 0x10;
          local_10b4 = 0x10;
          local_11e4 = local_1b1c;
          local_11e8 = local_1b18;
          local_11ec = local_1b14;
          local_1200 = local_1b38;
          local_1204 = local_1b30;
          local_1210 = local_1b28;
          local_165d = 1;
          local_183d = 1;
          local_1e48 = 0;
          local_1e60 = 0;
          local_1ed8 = 0;
          local_1ec8 = 0;
          local_1ec0 = 0;
          local_1eb0 = 0;
          local_1eac = 0;
          local_1ea8 = 0;
          local_1ea4 = 0;
          local_1ea0 = 0;
          local_1e98 = 0;
          local_1ed0 = 0;
          local_1edc = local_1afc * local_1af8;
          local_a68 = 0;
          uStack_a60 = 0;
          local_1ef8 = ZEXT816(0);
          local_a78 = 0;
          uStack_a70 = 0;
          local_1f08 = ZEXT816(0);
          local_a88 = 0;
          uStack_a80 = 0;
          local_1f18 = ZEXT816(0);
          local_a98 = 0;
          uStack_a90 = 0;
          local_1f28 = ZEXT816(0);
          local_aa8 = 0;
          uStack_aa0 = 0;
          local_1f38 = ZEXT816(0);
          local_ab8 = 0;
          uStack_ab0 = 0;
          local_1f48 = ZEXT816(0);
          local_ac8 = 0;
          uStack_ac0 = 0;
          local_1f58 = ZEXT816(0);
          local_ad8 = 0;
          uStack_ad0 = 0;
          local_1f68 = ZEXT816(0);
          local_1f6c = 0;
          local_1e90 = local_1428;
          local_1e40 = local_11f8;
          while( true ) {
            if (local_1edc <= local_1f6c) break;
            local_c78 = local_1e40;
            local_1f88 = *(undefined8 *)*local_1e40;
            uStack_1f80 = *(undefined8 *)(*local_1e40 + 8);
            local_b08 = ZEXT816(0) << 0x20;
            local_9a8 = 0;
            local_ae8._8_8_ = SUB168(ZEXT816(0),4);
            uStack_9a0 = local_ae8._8_8_;
            auVar4._8_8_ = 0;
            auVar4._0_8_ = local_ae8._8_8_;
            local_1f98 = vpcmpgtb_avx(auVar4 << 0x40,*local_1e40);
            local_8f8 = local_1f98._0_8_;
            uStack_8f0 = local_1f98._8_8_;
            local_1fa8 = vpunpcklbw_avx(*local_1e40,local_1f98);
            local_838 = local_1f98._0_8_;
            uStack_830 = local_1f98._8_8_;
            local_1fb8 = vpunpckhbw_avx(*local_1e40,local_1f98);
            local_c80 = local_1e90;
            local_1fc8 = *(undefined8 *)*local_1e90;
            uStack_1fc0 = *(undefined8 *)(*local_1e90 + 8);
            local_c88 = local_1e90 + 1;
            local_1fd8 = *(undefined8 *)*local_c88;
            uStack_1fd0 = *(undefined8 *)(local_1e90[1] + 8);
            local_9c8 = 0;
            uStack_9c0 = local_ae8._8_8_;
            auVar5._8_8_ = 0;
            auVar5._0_8_ = local_ae8._8_8_;
            local_1fe8 = vpcmpgtb_avx(auVar5 << 0x40,*local_1e90);
            local_9e8 = 0;
            uStack_9e0 = local_ae8._8_8_;
            auVar6._8_8_ = 0;
            auVar6._0_8_ = local_ae8._8_8_;
            local_1ff8 = vpcmpgtb_avx(auVar6 << 0x40,*local_c88);
            local_918 = local_1fe8._0_8_;
            uStack_910 = local_1fe8._8_8_;
            local_2008 = vpunpcklbw_avx(*local_1e90,local_1fe8);
            local_858 = local_1fe8._0_8_;
            uStack_850 = local_1fe8._8_8_;
            local_2018 = vpunpckhbw_avx(*local_1e90,local_1fe8);
            local_938 = local_1ff8._0_8_;
            uStack_930 = local_1ff8._8_8_;
            local_2028 = vpunpcklbw_avx(*local_c88,local_1ff8);
            local_878 = local_1ff8._0_8_;
            uStack_870 = local_1ff8._8_8_;
            local_2038 = vpunpckhbw_avx(*local_c88,local_1ff8);
            local_648 = local_1fa8._0_8_;
            uStack_640 = local_1fa8._8_8_;
            local_658 = local_2008._0_8_;
            uStack_650 = local_2008._8_8_;
            local_cf8 = vpmaddwd_avx(local_1fa8,local_2008);
            local_d08 = local_1ef8._0_8_;
            uStack_d00 = local_1ef8._8_8_;
            local_1ef8 = vpaddd_avx(local_cf8,local_1ef8);
            local_668 = local_1fa8._0_8_;
            uStack_660 = local_1fa8._8_8_;
            local_678 = local_2018._0_8_;
            uStack_670 = local_2018._8_8_;
            local_d18 = vpmaddwd_avx(local_1fa8,local_2018);
            local_d28 = local_1f08._0_8_;
            uStack_d20 = local_1f08._8_8_;
            local_1f08 = vpaddd_avx(local_d18,local_1f08);
            local_688 = local_1fa8._0_8_;
            uStack_680 = local_1fa8._8_8_;
            local_698 = local_2028._0_8_;
            uStack_690 = local_2028._8_8_;
            local_d38 = vpmaddwd_avx(local_1fa8,local_2028);
            local_d48 = local_1f18._0_8_;
            uStack_d40 = local_1f18._8_8_;
            local_1f18 = vpaddd_avx(local_d38,local_1f18);
            local_6a8 = local_1fa8._0_8_;
            uStack_6a0 = local_1fa8._8_8_;
            local_6b8 = local_2038._0_8_;
            uStack_6b0 = local_2038._8_8_;
            local_d58 = vpmaddwd_avx(local_1fa8,local_2038);
            local_d68 = local_1f28._0_8_;
            uStack_d60 = local_1f28._8_8_;
            local_1f28 = vpaddd_avx(local_d58,local_1f28);
            local_6c8 = local_1fb8._0_8_;
            uStack_6c0 = local_1fb8._8_8_;
            local_6d8 = local_2008._0_8_;
            uStack_6d0 = local_2008._8_8_;
            local_d78 = vpmaddwd_avx(local_1fb8,local_2008);
            local_d88 = local_1f38._0_8_;
            uStack_d80 = local_1f38._8_8_;
            local_1f38 = vpaddd_avx(local_d78,local_1f38);
            local_6e8 = local_1fb8._0_8_;
            uStack_6e0 = local_1fb8._8_8_;
            local_6f8 = local_2018._0_8_;
            uStack_6f0 = local_2018._8_8_;
            local_d98 = vpmaddwd_avx(local_1fb8,local_2018);
            local_da8 = local_1f48._0_8_;
            uStack_da0 = local_1f48._8_8_;
            local_1f48 = vpaddd_avx(local_d98,local_1f48);
            local_708 = local_1fb8._0_8_;
            uStack_700 = local_1fb8._8_8_;
            local_718 = local_2028._0_8_;
            uStack_710 = local_2028._8_8_;
            local_db8 = vpmaddwd_avx(local_1fb8,local_2028);
            local_dc8 = local_1f58._0_8_;
            uStack_dc0 = local_1f58._8_8_;
            local_1f58 = vpaddd_avx(local_db8,local_1f58);
            local_728 = local_1fb8._0_8_;
            uStack_720 = local_1fb8._8_8_;
            local_738 = local_2038._0_8_;
            uStack_730 = local_2038._8_8_;
            local_dd8 = vpmaddwd_avx(local_1fb8,local_2038);
            local_de8 = local_1f68._0_8_;
            uStack_de0 = local_1f68._8_8_;
            local_1f68 = vpaddd_avx(local_dd8,local_1f68);
            local_1e40 = local_1e40 + 1;
            local_1e90 = local_1e90 + 2;
            local_1f6c = local_1f6c + 1;
            local_af8 = local_b08;
            local_ae8 = local_b08;
            local_9f8 = local_1fd8;
            uStack_9f0 = uStack_1fd0;
            local_9d8 = local_1fc8;
            uStack_9d0 = uStack_1fc0;
            local_9b8 = local_1f88;
            uStack_9b0 = uStack_1f80;
            local_928 = local_1fd8;
            uStack_920 = uStack_1fd0;
            local_908 = local_1fc8;
            uStack_900 = uStack_1fc0;
            local_8e8 = local_1f88;
            uStack_8e0 = uStack_1f80;
            local_868 = local_1fd8;
            uStack_860 = uStack_1fd0;
            local_848 = local_1fc8;
            uStack_840 = uStack_1fc0;
            local_828 = local_1f88;
            uStack_820 = uStack_1f80;
          }
          local_588 = local_1ef8._0_8_;
          uStack_580 = local_1ef8._8_8_;
          local_598 = local_1f08._0_8_;
          uStack_590 = local_1f08._8_8_;
          local_2048 = vpunpckldq_avx(local_1ef8,local_1f08);
          local_5a8 = local_1f18._0_8_;
          uStack_5a0 = local_1f18._8_8_;
          local_5b8 = local_1f28._0_8_;
          uStack_5b0 = local_1f28._8_8_;
          local_2058 = vpunpckldq_avx(local_1f18,local_1f28);
          local_4c8 = local_1ef8._0_8_;
          uStack_4c0 = local_1ef8._8_8_;
          local_4d8 = local_1f08._0_8_;
          uStack_4d0 = local_1f08._8_8_;
          local_2068 = vpunpckhdq_avx(local_1ef8,local_1f08);
          local_4e8 = local_1f18._0_8_;
          uStack_4e0 = local_1f18._8_8_;
          local_4f8 = local_1f28._0_8_;
          uStack_4f0 = local_1f28._8_8_;
          local_2078 = vpunpckhdq_avx(local_1f18,local_1f28);
          local_408 = local_2048._0_8_;
          uStack_400 = local_2048._8_8_;
          local_418 = local_2058._0_8_;
          uStack_410 = local_2058._8_8_;
          auVar4 = vpunpcklqdq_avx(local_2048,local_2058);
          local_348 = local_2048._0_8_;
          uStack_340 = local_2048._8_8_;
          local_358 = local_2058._0_8_;
          uStack_350 = local_2058._8_8_;
          local_1f08 = vpunpckhqdq_avx(local_2048,local_2058);
          local_428 = local_2068._0_8_;
          uStack_420 = local_2068._8_8_;
          local_438 = local_2078._0_8_;
          uStack_430 = local_2078._8_8_;
          auVar5 = vpunpcklqdq_avx(local_2068,local_2078);
          local_368 = local_2068._0_8_;
          uStack_360 = local_2068._8_8_;
          local_378 = local_2078._0_8_;
          uStack_370 = local_2078._8_8_;
          local_1f28 = vpunpckhqdq_avx(local_2068,local_2078);
          local_5c8 = local_1f38._0_8_;
          uStack_5c0 = local_1f38._8_8_;
          local_5d8 = local_1f48._0_8_;
          uStack_5d0 = local_1f48._8_8_;
          local_2088 = vpunpckldq_avx(local_1f38,local_1f48);
          local_5e8 = local_1f58._0_8_;
          uStack_5e0 = local_1f58._8_8_;
          local_5f8 = local_1f68._0_8_;
          uStack_5f0 = local_1f68._8_8_;
          local_2098 = vpunpckldq_avx(local_1f58,local_1f68);
          local_508 = local_1f38._0_8_;
          uStack_500 = local_1f38._8_8_;
          local_518 = local_1f48._0_8_;
          uStack_510 = local_1f48._8_8_;
          local_20a8 = vpunpckhdq_avx(local_1f38,local_1f48);
          local_528 = local_1f58._0_8_;
          uStack_520 = local_1f58._8_8_;
          local_538 = local_1f68._0_8_;
          uStack_530 = local_1f68._8_8_;
          local_20b8 = vpunpckhdq_avx(local_1f58,local_1f68);
          local_448 = local_2088._0_8_;
          uStack_440 = local_2088._8_8_;
          local_458 = local_2098._0_8_;
          uStack_450 = local_2098._8_8_;
          auVar6 = vpunpcklqdq_avx(local_2088,local_2098);
          local_388 = local_2088._0_8_;
          uStack_380 = local_2088._8_8_;
          local_398 = local_2098._0_8_;
          uStack_390 = local_2098._8_8_;
          local_1f48 = vpunpckhqdq_avx(local_2088,local_2098);
          local_468 = local_20a8._0_8_;
          uStack_460 = local_20a8._8_8_;
          local_478 = local_20b8._0_8_;
          uStack_470 = local_20b8._8_8_;
          auVar7 = vpunpcklqdq_avx(local_20a8,local_20b8);
          local_3a8 = local_20a8._0_8_;
          uStack_3a0 = local_20a8._8_8_;
          local_3b8 = local_20b8._0_8_;
          uStack_3b0 = local_20b8._8_8_;
          local_1f68 = vpunpckhqdq_avx(local_20a8,local_20b8);
          local_1ef8._0_8_ = auVar4._0_8_;
          local_1ef8._8_8_ = auVar4._8_8_;
          local_df8 = local_1ef8._0_8_;
          uStack_df0 = local_1ef8._8_8_;
          local_e08 = local_1f08._0_8_;
          uStack_e00 = local_1f08._8_8_;
          auVar4 = vpaddd_avx(auVar4,local_1f08);
          local_1f18._0_8_ = auVar5._0_8_;
          local_1f18._8_8_ = auVar5._8_8_;
          local_e18 = local_1f18._0_8_;
          uStack_e10 = local_1f18._8_8_;
          local_e28 = local_1f28._0_8_;
          uStack_e20 = local_1f28._8_8_;
          local_1f18 = vpaddd_avx(auVar5,local_1f28);
          local_1f38._0_8_ = auVar6._0_8_;
          local_1f38._8_8_ = auVar6._8_8_;
          local_e38 = local_1f38._0_8_;
          uStack_e30 = local_1f38._8_8_;
          local_e48 = local_1f48._0_8_;
          uStack_e40 = local_1f48._8_8_;
          auVar5 = vpaddd_avx(auVar6,local_1f48);
          local_1f58._0_8_ = auVar7._0_8_;
          local_1f58._8_8_ = auVar7._8_8_;
          local_e58 = local_1f58._0_8_;
          uStack_e50 = local_1f58._8_8_;
          local_e68 = local_1f68._0_8_;
          uStack_e60 = local_1f68._8_8_;
          local_1f58 = vpaddd_avx(auVar7,local_1f68);
          local_1ef8._0_8_ = auVar4._0_8_;
          local_1ef8._8_8_ = auVar4._8_8_;
          local_e78 = local_1ef8._0_8_;
          uStack_e70 = local_1ef8._8_8_;
          local_e88 = local_1f18._0_8_;
          uStack_e80 = local_1f18._8_8_;
          local_1ef8 = vpaddd_avx(auVar4,local_1f18);
          local_1f38._0_8_ = auVar5._0_8_;
          local_1f38._8_8_ = auVar5._8_8_;
          local_e98 = local_1f38._0_8_;
          uStack_e90 = local_1f38._8_8_;
          local_ea8 = local_1f58._0_8_;
          uStack_ea0 = local_1f58._8_8_;
          local_1f38 = vpaddd_avx(auVar5,local_1f58);
          local_c10 = &local_20d8;
          local_c28 = local_1ef8._0_8_;
          uStack_c20 = local_1ef8._8_8_;
          uStack_20d4 = local_1ef8._4_4_;
          local_20d8 = local_1ef8._0_4_;
          uStack_20cc = local_1ef8._12_4_;
          uStack_20d0 = local_1ef8._8_4_;
          local_c30 = &local_20c8;
          local_c48 = local_1f38._0_8_;
          uStack_c40 = local_1f38._8_8_;
          uStack_20c4 = local_1f38._4_4_;
          local_20c8 = local_1f38._0_4_;
          uStack_20bc = local_1f38._12_4_;
          uStack_20c0 = local_1f38._8_4_;
          *local_1cf8 = local_20d8;
          *local_1d48 = uStack_20d4;
          *local_1d98 = uStack_20d0;
          *local_1de8 = uStack_20cc;
          local_1cf8[1] = local_20c8;
          local_1d48[1] = uStack_20c4;
          local_1d98[1] = uStack_20c0;
          local_1de8[1] = uStack_20bc;
          local_1cf8 = local_1cf8 + 2;
          local_1d48 = local_1d48 + 2;
          local_1d98 = local_1d98 + 2;
          local_1de8 = local_1de8 + 2;
          local_1998 = local_1a80;
          local_1988 = local_1a88;
          local_1eb8 = local_1440;
        }
        for (; local_1e34 < local_1af4; local_1e34 = local_1e34 + 1) {
          local_186c = local_1e34 / 2 + local_1e34 % 2;
          local_1860 = &local_2128;
          local_1868 = &local_1b48;
          local_11c0 = (ulong *)((long)local_1b48 + local_1b08 * local_186c * local_1b38);
          local_11a8 = &local_2128;
          local_10c0 = (long)local_1b1c * (long)local_1b18 * local_1b38;
          local_bb8 = &local_2128;
          local_1a78 = &local_2128;
          local_2108 = local_1b28;
          local_10c4 = 0x10;
          local_11ac = local_1b1c;
          local_11b0 = local_1b18;
          local_11b4 = local_1b14;
          local_11c8 = local_1b38;
          local_11cc = local_1b30;
          local_11d8 = local_1b28;
          local_186d = 1;
          local_2128 = 0;
          local_2118 = 0;
          local_2110 = 0;
          local_20fc = 0;
          local_20f8 = 0;
          local_20f4 = 0;
          local_20f0 = 0;
          local_2120 = 0;
          local_168c = local_1cec / 4;
          local_1680 = &local_2178;
          local_13dc = *(int *)((long)local_1ae8 + 0x2c);
          local_13e0 = (int)local_1ae8[6];
          local_13e4 = *(undefined4 *)((long)local_1ae8 + 0x34);
          local_13f0 = (undefined1 (*) [16])
                       (*local_1ae8 + local_1ae8[8] * (long)local_168c * local_1ae8[2]);
          local_13f8 = local_1ae8[2];
          local_13fc = (undefined4)local_1ae8[3];
          local_1408 = local_1ae8[4];
          local_13d8 = &local_2178;
          local_1020 = (long)local_13dc * (long)local_13e0 * local_13f8;
          local_1024 = 0x10;
          local_168d = 1;
          local_20e8 = 0;
          local_2100 = 0;
          local_cd0 = &local_2178;
          local_1a70 = &local_2178;
          local_2178 = 0;
          local_2168 = 0;
          local_2160 = 0;
          local_2150 = 0;
          local_214c = 0;
          local_2148 = 0;
          local_2144 = 0;
          local_2140 = 0;
          local_2138 = 0;
          local_2170 = 0;
          local_217c = local_1afc * local_1af8;
          local_b18 = 0;
          uStack_b10 = 0;
          local_2198 = ZEXT816(0);
          local_b28 = 0;
          uStack_b20 = 0;
          local_21a8 = ZEXT816(0);
          local_b38 = 0;
          uStack_b30 = 0;
          local_21b8 = ZEXT816(0);
          local_b48 = 0;
          uStack_b40 = 0;
          local_21c8 = ZEXT816(0);
          local_21cc = 0;
          local_2130 = local_13f0;
          local_20e0 = local_11c0;
          while( true ) {
            if (local_217c <= local_21cc) break;
            local_2c0 = local_20e0;
            local_2d8 = *local_20e0;
            uStack_2d0 = 0;
            uStack_280 = 0;
            auVar7._8_8_ = 0;
            auVar7._0_8_ = local_2d8;
            local_21e8 = vpmovsxbw_avx(auVar7);
            local_c90 = local_2130;
            local_21f8 = *(undefined8 *)*local_2130;
            uStack_21f0 = *(undefined8 *)(*local_2130 + 8);
            local_c98 = local_2130 + 1;
            local_2208 = *(undefined8 *)*local_c98;
            uStack_2200 = *(undefined8 *)(local_2130[1] + 8);
            local_b68 = ZEXT816(0) << 0x20;
            local_a08 = 0;
            local_b58._8_8_ = SUB168(ZEXT816(0),4);
            uStack_a00 = local_b58._8_8_;
            auVar8._8_8_ = 0;
            auVar8._0_8_ = local_b58._8_8_;
            local_2218 = vpcmpgtb_avx(auVar8 << 0x40,*local_2130);
            local_a28 = 0;
            uStack_a20 = local_b58._8_8_;
            auVar9._8_8_ = 0;
            auVar9._0_8_ = local_b58._8_8_;
            local_2228 = vpcmpgtb_avx(auVar9 << 0x40,*local_c98);
            local_958 = local_2218._0_8_;
            uStack_950 = local_2218._8_8_;
            local_2238 = vpunpcklbw_avx(*local_2130,local_2218);
            local_898 = local_2218._0_8_;
            uStack_890 = local_2218._8_8_;
            local_2248 = vpunpckhbw_avx(*local_2130,local_2218);
            local_978 = local_2228._0_8_;
            uStack_970 = local_2228._8_8_;
            local_2258 = vpunpcklbw_avx(*local_c98,local_2228);
            local_8b8 = local_2228._0_8_;
            uStack_8b0 = local_2228._8_8_;
            local_2268 = vpunpckhbw_avx(*local_c98,local_2228);
            local_748 = local_21e8._0_8_;
            uStack_740 = local_21e8._8_8_;
            local_758 = local_2238._0_8_;
            uStack_750 = local_2238._8_8_;
            local_eb8 = vpmaddwd_avx(local_21e8,local_2238);
            local_ec8 = local_2198._0_8_;
            uStack_ec0 = local_2198._8_8_;
            local_2198 = vpaddd_avx(local_eb8,local_2198);
            local_768 = local_21e8._0_8_;
            uStack_760 = local_21e8._8_8_;
            local_778 = local_2248._0_8_;
            uStack_770 = local_2248._8_8_;
            local_ed8 = vpmaddwd_avx(local_21e8,local_2248);
            local_ee8 = local_21a8._0_8_;
            uStack_ee0 = local_21a8._8_8_;
            local_21a8 = vpaddd_avx(local_ed8,local_21a8);
            local_788 = local_21e8._0_8_;
            uStack_780 = local_21e8._8_8_;
            local_798 = local_2258._0_8_;
            uStack_790 = local_2258._8_8_;
            local_ef8 = vpmaddwd_avx(local_21e8,local_2258);
            local_f08 = local_21b8._0_8_;
            uStack_f00 = local_21b8._8_8_;
            local_21b8 = vpaddd_avx(local_ef8,local_21b8);
            local_7a8 = local_21e8._0_8_;
            uStack_7a0 = local_21e8._8_8_;
            local_7b8 = local_2268._0_8_;
            uStack_7b0 = local_2268._8_8_;
            local_f18 = vpmaddwd_avx(local_21e8,local_2268);
            local_f28 = local_21c8._0_8_;
            uStack_f20 = local_21c8._8_8_;
            local_21c8 = vpaddd_avx(local_f18,local_21c8);
            local_20e0 = local_20e0 + 1;
            local_2130 = local_2130 + 2;
            local_21cc = local_21cc + 1;
            local_b58 = local_b68;
            local_a38 = local_2208;
            uStack_a30 = uStack_2200;
            local_a18 = local_21f8;
            uStack_a10 = uStack_21f0;
            local_968 = local_2208;
            uStack_960 = uStack_2200;
            local_948 = local_21f8;
            uStack_940 = uStack_21f0;
            local_8a8 = local_2208;
            uStack_8a0 = uStack_2200;
            local_888 = local_21f8;
            uStack_880 = uStack_21f0;
            local_288 = local_2d8;
          }
          local_608 = local_2198._0_8_;
          uStack_600 = local_2198._8_8_;
          local_618 = local_21a8._0_8_;
          uStack_610 = local_21a8._8_8_;
          local_2278 = vpunpckldq_avx(local_2198,local_21a8);
          local_628 = local_21b8._0_8_;
          uStack_620 = local_21b8._8_8_;
          local_638 = local_21c8._0_8_;
          uStack_630 = local_21c8._8_8_;
          local_2288 = vpunpckldq_avx(local_21b8,local_21c8);
          local_548 = local_2198._0_8_;
          uStack_540 = local_2198._8_8_;
          local_558 = local_21a8._0_8_;
          uStack_550 = local_21a8._8_8_;
          local_2298 = vpunpckhdq_avx(local_2198,local_21a8);
          local_568 = local_21b8._0_8_;
          uStack_560 = local_21b8._8_8_;
          local_578 = local_21c8._0_8_;
          uStack_570 = local_21c8._8_8_;
          local_22a8 = vpunpckhdq_avx(local_21b8,local_21c8);
          local_488 = local_2278._0_8_;
          uStack_480 = local_2278._8_8_;
          local_498 = local_2288._0_8_;
          uStack_490 = local_2288._8_8_;
          auVar4 = vpunpcklqdq_avx(local_2278,local_2288);
          local_3c8 = local_2278._0_8_;
          uStack_3c0 = local_2278._8_8_;
          local_3d8 = local_2288._0_8_;
          uStack_3d0 = local_2288._8_8_;
          local_21a8 = vpunpckhqdq_avx(local_2278,local_2288);
          local_4a8 = local_2298._0_8_;
          uStack_4a0 = local_2298._8_8_;
          local_4b8 = local_22a8._0_8_;
          uStack_4b0 = local_22a8._8_8_;
          auVar5 = vpunpcklqdq_avx(local_2298,local_22a8);
          local_3e8 = local_2298._0_8_;
          uStack_3e0 = local_2298._8_8_;
          local_3f8 = local_22a8._0_8_;
          uStack_3f0 = local_22a8._8_8_;
          local_21c8 = vpunpckhqdq_avx(local_2298,local_22a8);
          local_2198._0_8_ = auVar4._0_8_;
          local_2198._8_8_ = auVar4._8_8_;
          local_f38 = local_2198._0_8_;
          uStack_f30 = local_2198._8_8_;
          local_f48 = local_21a8._0_8_;
          uStack_f40 = local_21a8._8_8_;
          auVar4 = vpaddd_avx(auVar4,local_21a8);
          local_21b8._0_8_ = auVar5._0_8_;
          local_21b8._8_8_ = auVar5._8_8_;
          local_f58 = local_21b8._0_8_;
          uStack_f50 = local_21b8._8_8_;
          local_f68 = local_21c8._0_8_;
          uStack_f60 = local_21c8._8_8_;
          local_21b8 = vpaddd_avx(auVar5,local_21c8);
          local_2198._0_8_ = auVar4._0_8_;
          local_2198._8_8_ = auVar4._8_8_;
          local_f78 = local_2198._0_8_;
          uStack_f70 = local_2198._8_8_;
          local_f88 = local_21b8._0_8_;
          uStack_f80 = local_21b8._8_8_;
          local_2198 = vpaddd_avx(auVar4,local_21b8);
          local_c50 = &local_22b8;
          local_c68 = local_2198._0_8_;
          uStack_c60 = local_2198._8_8_;
          uStack_22b4 = local_2198._4_4_;
          local_22b8 = local_2198._0_4_;
          uStack_22ac = local_2198._12_4_;
          uStack_22b0 = local_2198._8_4_;
          *local_1cf8 = local_22b8;
          *local_1d48 = uStack_22b4;
          *local_1d98 = uStack_22b0;
          *local_1de8 = uStack_22ac;
          local_1cf8 = local_1cf8 + 1;
          local_1d48 = local_1d48 + 1;
          local_1d98 = local_1d98 + 1;
          local_1de8 = local_1de8 + 1;
          local_19b8 = local_1a70;
          local_19a8 = local_1a78;
          local_2158 = local_1408;
        }
        local_1978 = local_1a90;
        local_1968 = local_1a98;
        local_1958 = local_1aa0;
        local_1948 = local_1aa8;
        local_177c = local_1cec;
        local_1e10 = local_1248;
        local_1dc0 = local_1280;
        local_1d70 = local_12b8;
        local_1d20 = local_12f0;
      }
      local_1ce4 = local_1ce0 * 4;
      for (local_22bc = local_1ce4; local_22bc < local_1b00; local_22bc = local_22bc + 1) {
        local_1890 = &local_2310;
        local_1174 = *(int *)((long)local_1ae0 + 0x2c);
        local_1178 = (int)local_1ae0[6];
        local_117c = *(undefined4 *)((long)local_1ae0 + 0x34);
        local_1188 = (undefined4 *)(*local_1ae0 + local_1ae0[8] * (long)local_22bc * local_1ae0[2]);
        local_1190 = local_1ae0[2];
        local_1194 = (undefined4)local_1ae0[3];
        local_11a0 = local_1ae0[4];
        local_1170 = &local_2310;
        local_10d0 = (long)local_1174 * (long)local_1178 * local_1190;
        local_bf0 = &local_2310;
        local_1a68 = &local_2310;
        local_10d4 = 0x10;
        local_189c = local_22bc;
        local_189d = 1;
        local_2310 = 0;
        local_2300 = 0;
        local_22f8 = 0;
        local_22e8 = 0;
        local_22e4 = 0;
        local_22e0 = 0;
        local_22dc = 0;
        local_22d8 = 0;
        local_22d0 = 0;
        local_2308 = 0;
        local_22c8 = local_1188;
        for (local_2314 = 0; local_2314 + 1 < local_1af4; local_2314 = local_2314 + 2) {
          local_18cc = local_2314 / 2;
          local_18c0 = &local_2368;
          local_18c8 = &local_1b48;
          local_1150 = (undefined1 (*) [16])
                       ((long)local_1b48 + local_1b08 * local_18cc * local_1b38);
          local_1138 = &local_2368;
          local_10e0 = (long)local_1b1c * (long)local_1b18 * local_1b38;
          local_bc0 = &local_2368;
          local_1a60 = &local_2368;
          local_16bc = local_22bc / 4 + local_22bc % 4;
          local_16b0 = &local_23b8;
          local_13a4 = *(int *)((long)local_1ae8 + 0x2c);
          local_13a8 = (int)local_1ae8[6];
          local_13ac = *(undefined4 *)((long)local_1ae8 + 0x34);
          local_13b8 = (ulong *)(*local_1ae8 + local_1ae8[8] * (long)local_16bc * local_1ae8[2]);
          local_13c0 = local_1ae8[2];
          local_13c4 = (undefined4)local_1ae8[3];
          local_13d0 = local_1ae8[4];
          local_13a0 = &local_23b8;
          local_1030 = (long)local_13a4 * (long)local_13a8 * local_13c0;
          local_cd8 = &local_23b8;
          local_1a58 = &local_23b8;
          local_2330 = 0;
          local_2334 = 0;
          local_2338 = 0;
          local_233c = 0;
          local_2348 = local_1b28;
          local_2350 = 0;
          local_2358 = 0;
          local_2360 = 0;
          local_2368 = 0;
          local_1034 = 0x10;
          local_10e4 = 0x10;
          local_113c = local_1b1c;
          local_1140 = local_1b18;
          local_1144 = local_1b14;
          local_1158 = local_1b38;
          local_115c = local_1b30;
          local_1168 = local_1b28;
          local_16bd = 1;
          local_18cd = 1;
          local_2328 = 0;
          local_2340 = 0;
          local_23b8 = 0;
          local_23a8 = 0;
          local_23a0 = 0;
          local_2390 = 0;
          local_238c = 0;
          local_2388 = 0;
          local_2384 = 0;
          local_2380 = 0;
          local_2378 = 0;
          local_23b0 = 0;
          local_23bc = local_1afc * local_1af8;
          local_b78 = 0;
          uStack_b70 = 0;
          local_23d8 = ZEXT816(0);
          local_b88 = 0;
          uStack_b80 = 0;
          local_23e8 = ZEXT816(0);
          local_23ec = 0;
          local_2370 = local_13b8;
          local_2320 = local_1150;
          while( true ) {
            if (local_23bc <= local_23ec) break;
            local_ca0 = local_2320;
            local_2408 = *(undefined8 *)*local_2320;
            uStack_2400 = *(undefined8 *)(*local_2320 + 8);
            local_a48 = 0;
            local_b98._8_8_ = SUB168(ZEXT816(0),4);
            uStack_a40 = local_b98._8_8_;
            auVar10._8_8_ = 0;
            auVar10._0_8_ = local_b98._8_8_;
            local_2418 = vpcmpgtb_avx(auVar10 << 0x40,*local_2320);
            local_998 = local_2418._0_8_;
            uStack_990 = local_2418._8_8_;
            local_2428 = vpunpcklbw_avx(*local_2320,local_2418);
            local_8d8 = local_2418._0_8_;
            uStack_8d0 = local_2418._8_8_;
            local_2438 = vpunpckhbw_avx(*local_2320,local_2418);
            local_2e0 = local_2370;
            local_2448 = *local_2370;
            uStack_2f0 = 0;
            uStack_2440 = 0;
            uStack_290 = 0;
            auVar1._8_8_ = 0;
            auVar1._0_8_ = local_2448;
            local_2458 = vpmovsxbw_avx(auVar1);
            local_7c8 = local_2428._0_8_;
            uStack_7c0 = local_2428._8_8_;
            local_7d8 = local_2458._0_8_;
            uStack_7d0 = local_2458._8_8_;
            local_f98 = vpmaddwd_avx(local_2428,local_2458);
            local_fa8 = local_23d8._0_8_;
            uStack_fa0 = local_23d8._8_8_;
            local_23d8 = vpaddd_avx(local_f98,local_23d8);
            local_7e8 = local_2438._0_8_;
            uStack_7e0 = local_2438._8_8_;
            local_7f8 = local_2458._0_8_;
            uStack_7f0 = local_2458._8_8_;
            local_fb8 = vpmaddwd_avx(local_2438,local_2458);
            local_fc8 = local_23e8._0_8_;
            uStack_fc0 = local_23e8._8_8_;
            local_23e8 = vpaddd_avx(local_fb8,local_23e8);
            local_2320 = local_2320 + 1;
            local_2370 = local_2370 + 1;
            local_23ec = local_23ec + 1;
            local_b98 = ZEXT816(0) << 0x20;
            local_a58 = local_2408;
            uStack_a50 = uStack_2400;
            local_988 = local_2408;
            uStack_980 = uStack_2400;
            local_8c8 = local_2408;
            uStack_8c0 = uStack_2400;
            local_2f8 = local_2448;
            local_298 = local_2448;
          }
          local_d8 = local_23d8._0_8_;
          uStack_d0 = local_23d8._8_8_;
          local_88 = local_23d8._0_8_;
          uStack_80 = local_23d8._8_8_;
          local_e8 = vpunpckhqdq_avx(local_23d8,local_23d8);
          local_98 = local_e8._0_8_;
          uStack_90 = local_e8._8_8_;
          local_a8 = local_23d8._0_8_;
          uStack_a0 = local_23d8._8_8_;
          local_f8 = vpaddd_avx(local_e8,local_23d8);
          local_108 = vpshufd_avx(local_f8,0xb1);
          local_b8 = local_f8._0_8_;
          uStack_b0 = local_f8._8_8_;
          local_c8 = local_108._0_8_;
          uStack_c0 = local_108._8_8_;
          local_118 = vpaddd_avx(local_f8,local_108);
          local_58 = local_118._0_8_;
          uStack_50 = local_118._8_8_;
          uStack_60 = local_118._8_8_;
          local_68._0_4_ = local_118._0_4_;
          *local_22c8 = (undefined4)local_68;
          local_188 = local_23e8._0_8_;
          uStack_180 = local_23e8._8_8_;
          local_138 = local_23e8._0_8_;
          uStack_130 = local_23e8._8_8_;
          local_198 = vpunpckhqdq_avx(local_23e8,local_23e8);
          local_148 = local_198._0_8_;
          uStack_140 = local_198._8_8_;
          local_158 = local_23e8._0_8_;
          uStack_150 = local_23e8._8_8_;
          local_1a8 = vpaddd_avx(local_198,local_23e8);
          local_1b8 = vpshufd_avx(local_1a8,0xb1);
          local_168 = local_1a8._0_8_;
          uStack_160 = local_1a8._8_8_;
          local_178 = local_1b8._0_8_;
          uStack_170 = local_1b8._8_8_;
          local_1c8 = vpaddd_avx(local_1a8,local_1b8);
          local_38 = local_1c8._0_8_;
          uStack_30 = local_1c8._8_8_;
          uStack_40 = local_1c8._8_8_;
          local_48._0_4_ = local_1c8._0_4_;
          local_22c8[1] = (undefined4)local_48;
          local_22c8 = local_22c8 + 2;
          local_19e8 = local_1a58;
          local_19d8 = local_1a60;
          local_128 = local_138;
          uStack_120 = uStack_130;
          local_78 = local_88;
          uStack_70 = uStack_80;
          local_68 = local_118._0_8_;
          local_48 = local_1c8._0_8_;
          local_2398 = local_13d0;
        }
        for (; local_2314 < local_1af4; local_2314 = local_2314 + 1) {
          local_18fc = local_2314 / 2 + local_2314 % 2;
          local_18f0 = &local_24a8;
          local_18f8 = &local_1b48;
          local_1118 = (ulong *)((long)local_1b48 + local_1b08 * local_18fc * local_1b38);
          local_1100 = &local_24a8;
          local_10f0 = (long)local_1b1c * (long)local_1b18 * local_1b38;
          local_bc8 = &local_24a8;
          local_1a50 = &local_24a8;
          local_16ec = local_22bc / 4 + local_22bc % 4;
          local_16e0 = &local_24f8;
          local_136c = *(int *)((long)local_1ae8 + 0x2c);
          local_1370 = (int)local_1ae8[6];
          local_1374 = *(undefined4 *)((long)local_1ae8 + 0x34);
          local_1380 = (ulong *)(*local_1ae8 + local_1ae8[8] * (long)local_16ec * local_1ae8[2]);
          local_1388 = local_1ae8[2];
          local_138c = (undefined4)local_1ae8[3];
          local_1398 = local_1ae8[4];
          local_1368 = &local_24f8;
          local_1040 = (long)local_136c * (long)local_1370 * local_1388;
          local_1044 = 0x10;
          local_10f4 = 0x10;
          local_1104 = local_1b1c;
          local_1108 = local_1b18;
          local_110c = local_1b14;
          local_1120 = local_1b38;
          local_1124 = local_1b30;
          local_1130 = local_1b28;
          local_ce0 = &local_24f8;
          local_1a48 = &local_24f8;
          local_2470 = 0;
          local_2474 = 0;
          local_2478 = 0;
          local_247c = 0;
          local_2488 = local_1b28;
          local_2490 = 0;
          local_2498 = 0;
          local_24a0 = 0;
          local_24a8 = 0;
          local_16ed = 1;
          local_18fd = 1;
          local_2468 = 0;
          local_2480 = 0;
          local_24f8 = 0;
          local_24e8 = 0;
          local_24e0 = 0;
          local_24d0 = 0;
          local_24cc = 0;
          local_24c8 = 0;
          local_24c4 = 0;
          local_24c0 = 0;
          local_24b8 = 0;
          local_24f0 = 0;
          local_ba8 = 0;
          uStack_ba0 = 0;
          local_2518 = ZEXT816(0);
          local_251c = 0;
          local_24b0 = local_1380;
          local_2460 = local_1118;
          while( true ) {
            if (local_1afc * local_1af8 <= local_251c) break;
            local_300 = local_2460;
            local_318 = *local_2460;
            uStack_310 = 0;
            uStack_2a0 = 0;
            auVar2._8_8_ = 0;
            auVar2._0_8_ = local_318;
            auVar4 = vpmovsxbw_avx(auVar2);
            local_320 = local_24b0;
            local_338 = *local_24b0;
            uStack_330 = 0;
            uStack_2b0 = 0;
            auVar3._8_8_ = 0;
            auVar3._0_8_ = local_338;
            auVar5 = vpmovsxbw_avx(auVar3);
            local_2548 = auVar4._0_8_;
            local_808 = local_2548;
            uStack_2540 = auVar4._8_8_;
            uStack_800 = uStack_2540;
            local_2568 = auVar5._0_8_;
            local_818 = local_2568;
            uStack_2560 = auVar5._8_8_;
            uStack_810 = uStack_2560;
            local_fd8 = vpmaddwd_avx(auVar4,auVar5);
            local_fe8 = local_2518._0_8_;
            uStack_fe0 = local_2518._8_8_;
            local_2518 = vpaddd_avx(local_fd8,local_2518);
            local_2460 = local_2460 + 1;
            local_24b0 = local_24b0 + 1;
            local_251c = local_251c + 1;
            local_2b8 = local_338;
            local_2a8 = local_318;
          }
          local_238 = local_2518._0_8_;
          uStack_230 = local_2518._8_8_;
          local_1e8 = local_2518._0_8_;
          uStack_1e0 = local_2518._8_8_;
          local_248 = vpunpckhqdq_avx(local_2518,local_2518);
          local_1f8 = local_248._0_8_;
          uStack_1f0 = local_248._8_8_;
          local_208 = local_2518._0_8_;
          uStack_200 = local_2518._8_8_;
          local_258 = vpaddd_avx(local_248,local_2518);
          local_268 = vpshufd_avx(local_258,0xb1);
          local_218 = local_258._0_8_;
          uStack_210 = local_258._8_8_;
          local_228 = local_268._0_8_;
          uStack_220 = local_268._8_8_;
          local_278 = vpaddd_avx(local_258,local_268);
          local_18 = local_278._0_8_;
          uStack_10 = local_278._8_8_;
          uStack_20 = local_278._8_8_;
          local_28._0_4_ = local_278._0_4_;
          *local_22c8 = (undefined4)local_28;
          local_22c8 = local_22c8 + 1;
          local_1a08 = local_1a48;
          local_19f8 = local_1a50;
          local_1d8 = local_1e8;
          uStack_1d0 = uStack_1e0;
          local_28 = local_278._0_8_;
          local_24d8 = local_1398;
        }
        local_19c8 = local_1a68;
        local_22f0 = local_11a0;
      }
      ppvVar12 = &local_1b48;
      if (local_1b40 != (int *)0x0) {
        local_1a1c = 0xffffffff;
        LOCK();
        local_1a20 = *local_1b40;
        *local_1b40 = *local_1b40 + -1;
        UNLOCK();
        if (local_1a20 == 1) {
          local_1a40 = ppvVar12;
          local_1a18 = ppvVar12;
          if (local_1b28 == (long *)0x0) {
            local_14c0 = local_1b48;
            if (local_1b48 != (void *)0x0) {
              free(local_1b48);
            }
          }
          else {
            (**(code **)(*local_1b28 + 0x18))(local_1b28,local_1b48);
          }
        }
      }
      *ppvVar12 = (void *)0x0;
      ppvVar12[2] = (void *)0x0;
      *(undefined4 *)(ppvVar12 + 3) = 0;
      *(undefined4 *)(ppvVar12 + 5) = 0;
      *(undefined4 *)((long)ppvVar12 + 0x2c) = 0;
      *(undefined4 *)(ppvVar12 + 6) = 0;
      *(undefined4 *)((long)ppvVar12 + 0x34) = 0;
      *(undefined4 *)(ppvVar12 + 7) = 0;
      ppvVar12[8] = (void *)0x0;
      ppvVar12[1] = (void *)0x0;
    }
    else {
      im2col_sgemm_pack8to1_int8_sse_xop
                ((Mat *)CONCAT44(in_stack_ffffffffffffd794,in_stack_ffffffffffffd790),
                 in_stack_ffffffffffffd788,in_stack_ffffffffffffd780,in_stack_ffffffffffffd778);
    }
  }
  else {
    im2col_sgemm_pack8to1_int8_sse_avx2
              ((Mat *)CONCAT44(in_stack_ffffffffffffd794,in_stack_ffffffffffffd790),
               in_stack_ffffffffffffd788,in_stack_ffffffffffffd780,in_stack_ffffffffffffd778);
  }
  return;
}

Assistant:

static void im2col_sgemm_pack8to1_int8_sse(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Option& opt)
{
#if !(__AVX512VNNI__ || __AVXVNNI__ || __AVX2__ || __XOP__)
#if NCNN_RUNTIME_CPU && NCNN_AVX512VNNI && __AVX512F__ && !__AVX512VNNI__
    if (ncnn::cpu_support_x86_avx512_vnni())
    {
        im2col_sgemm_pack8to1_int8_sse_avx512vnni(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVXVNNI && __AVX2__ && !__AVXVNNI__
    if (ncnn::cpu_support_x86_avx_vnni())
    {
        im2col_sgemm_pack8to1_int8_sse_avxvnni(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVX2 && __AVX__ && !__AVX2__
    if (ncnn::cpu_support_x86_avx2())
    {
        im2col_sgemm_pack8to1_int8_sse_avx2(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_XOP && __SSE2__ && !__XOP__
    if (ncnn::cpu_support_x86_xop())
    {
        im2col_sgemm_pack8to1_int8_sse_xop(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif
#endif

    // Mat bottom_im2col(size, maxk, inch, 8u, 8, opt.workspace_allocator);

    const int size = bottom_im2col.w;
    const int maxk = bottom_im2col.h;
    const int inch = bottom_im2col.c;

    const int outch = top_blob.c;

    // permute
    Mat tmp;
#if __AVX2__
    if (size >= 4)
        tmp.create(4 * maxk, inch, size / 4 + (size % 4) / 2 + size % 2, 8u, 8, opt.workspace_allocator);
    else if (size >= 2)
        tmp.create(2 * maxk, inch, size / 2 + size % 2, 8u, 8, opt.workspace_allocator);
    else
        tmp.create(maxk, inch, size, 8u, 8, opt.workspace_allocator);
#else
    if (size >= 2)
        tmp.create(2 * maxk, inch, size / 2 + size % 2, 8u, 8, opt.workspace_allocator);
    else
        tmp.create(maxk, inch, size, 8u, 8, opt.workspace_allocator);
#endif
    {
#if __AVX2__
        int remain_size_start = 0;
        int nn_size = size >> 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 4;

            int64_t* tmpptr = tmp.channel(i / 4);

            for (int q = 0; q < inch; q++)
            {
                const int64_t* img0 = (const int64_t*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    __m256i _v = _mm256_loadu_si256((const __m256i*)img0);
                    _mm256_storeu_si256((__m256i*)tmpptr, _v);
                    tmpptr += 4;
                    img0 += size;
                }
            }
        }

        remain_size_start += nn_size << 2;
        nn_size = (size - remain_size_start) >> 1;
#else
        int remain_size_start = 0;
        int nn_size = (size - remain_size_start) >> 1;
#endif

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 2;

#if __AVX2__
            int64_t* tmpptr = tmp.channel(i / 4 + (i % 4) / 2);
#else
            int64_t* tmpptr = tmp.channel(i / 2);
#endif

            for (int q = 0; q < inch; q++)
            {
                const int64_t* img0 = (const int64_t*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    __m128i _v = _mm_loadu_si128((const __m128i*)img0);
                    _mm_storeu_si128((__m128i*)tmpptr, _v);
                    tmpptr += 2;
                    img0 += size;
                }
            }
        }

        remain_size_start += nn_size << 1;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_size_start; i < size; i++)
        {
#if __AVX2__
            int64_t* tmpptr = tmp.channel(i / 4 + (i % 4) / 2 + i % 2);
#else
            int64_t* tmpptr = tmp.channel(i / 2 + i % 2);
#endif

            for (int q = 0; q < inch; q++)
            {
                const int64_t* img0 = (const int64_t*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    tmpptr += 1;
                    img0 += size;
                }
            }
        }
    }

    int nn_outch = 0;
    int remain_outch_start = 0;

    nn_outch = outch >> 2;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int pp = 0; pp < nn_outch; pp++)
    {
        int p = pp * 4;

        int* outptr0 = top_blob.channel(p);
        int* outptr1 = top_blob.channel(p + 1);
        int* outptr2 = top_blob.channel(p + 2);
        int* outptr3 = top_blob.channel(p + 3);

        int i = 0;
#if __AVX2__
        for (; i + 3 < size; i += 4)
        {
            const signed char* tmpptr = tmp.channel(i / 4);
            const signed char* kptr0 = kernel.channel(p / 4);

            int nn = inch * maxk; // inch always > 0

            __m256i _sum00_11 = _mm256_setzero_si256();
            __m256i _sum10_01 = _mm256_setzero_si256();
            __m256i _sum02_13 = _mm256_setzero_si256();
            __m256i _sum12_03 = _mm256_setzero_si256();

            __m256i _sum04_15 = _mm256_setzero_si256();
            __m256i _sum14_05 = _mm256_setzero_si256();
            __m256i _sum06_17 = _mm256_setzero_si256();
            __m256i _sum16_07 = _mm256_setzero_si256();

            int j = 0;
            for (; j < nn; j++)
            {
                __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                __m256i _val01_16 = _mm256_cvtepi8_epi16(_val01);

                __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr0 + 16));
                __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);
                __m256i _w23_16 = _mm256_cvtepi8_epi16(_w23);

                __m256i _val10_16 = _mm256_permute4x64_epi64(_val01_16, 78);

#if __AVXVNNI__ || __AVX512VNNI__
                _sum00_11 = _mm256_dpwssd_epi32(_sum00_11, _val01_16, _w01_16);
                _sum10_01 = _mm256_dpwssd_epi32(_sum10_01, _val10_16, _w01_16);
                _sum02_13 = _mm256_dpwssd_epi32(_sum02_13, _val01_16, _w23_16);
                _sum12_03 = _mm256_dpwssd_epi32(_sum12_03, _val10_16, _w23_16);
#else
                _sum00_11 = _mm256_add_epi32(_sum00_11, _mm256_madd_epi16(_val01_16, _w01_16));
                _sum10_01 = _mm256_add_epi32(_sum10_01, _mm256_madd_epi16(_val10_16, _w01_16));
                _sum02_13 = _mm256_add_epi32(_sum02_13, _mm256_madd_epi16(_val01_16, _w23_16));
                _sum12_03 = _mm256_add_epi32(_sum12_03, _mm256_madd_epi16(_val10_16, _w23_16));
#endif

                __m128i _val23 = _mm_loadu_si128((const __m128i*)(tmpptr + 16));
                __m256i _val23_16 = _mm256_cvtepi8_epi16(_val23);
                __m256i _val32_16 = _mm256_permute4x64_epi64(_val23_16, 78);

#if __AVXVNNI__ || __AVX512VNNI__
                _sum04_15 = _mm256_dpwssd_epi32(_sum04_15, _val23_16, _w01_16);
                _sum14_05 = _mm256_dpwssd_epi32(_sum14_05, _val32_16, _w01_16);
                _sum06_17 = _mm256_dpwssd_epi32(_sum06_17, _val23_16, _w23_16);
                _sum16_07 = _mm256_dpwssd_epi32(_sum16_07, _val32_16, _w23_16);
#else
                _sum04_15 = _mm256_add_epi32(_sum04_15, _mm256_madd_epi16(_val23_16, _w01_16));
                _sum14_05 = _mm256_add_epi32(_sum14_05, _mm256_madd_epi16(_val32_16, _w01_16));
                _sum06_17 = _mm256_add_epi32(_sum06_17, _mm256_madd_epi16(_val23_16, _w23_16));
                _sum16_07 = _mm256_add_epi32(_sum16_07, _mm256_madd_epi16(_val32_16, _w23_16));
#endif

                tmpptr += 32;
                kptr0 += 32;
            }

            // transpose 4x8
            {
                __m256i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm256_unpacklo_epi32(_sum00_11, _sum10_01);
                _tmp1 = _mm256_unpacklo_epi32(_sum02_13, _sum12_03);
                _tmp2 = _mm256_unpackhi_epi32(_sum00_11, _sum10_01);
                _tmp3 = _mm256_unpackhi_epi32(_sum02_13, _sum12_03);
                _sum00_11 = _mm256_unpacklo_epi64(_tmp0, _tmp1);
                _sum10_01 = _mm256_unpackhi_epi64(_tmp0, _tmp1);
                _sum02_13 = _mm256_unpacklo_epi64(_tmp2, _tmp3);
                _sum12_03 = _mm256_unpackhi_epi64(_tmp2, _tmp3);
            }
            {
                __m256i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm256_unpacklo_epi32(_sum04_15, _sum14_05);
                _tmp1 = _mm256_unpacklo_epi32(_sum06_17, _sum16_07);
                _tmp2 = _mm256_unpackhi_epi32(_sum04_15, _sum14_05);
                _tmp3 = _mm256_unpackhi_epi32(_sum06_17, _sum16_07);
                _sum04_15 = _mm256_unpacklo_epi64(_tmp0, _tmp1);
                _sum14_05 = _mm256_unpackhi_epi64(_tmp0, _tmp1);
                _sum06_17 = _mm256_unpacklo_epi64(_tmp2, _tmp3);
                _sum16_07 = _mm256_unpackhi_epi64(_tmp2, _tmp3);
            }

            _sum00_11 = _mm256_add_epi32(_sum00_11, _sum10_01);
            _sum02_13 = _mm256_add_epi32(_sum02_13, _sum12_03);
            _sum00_11 = _mm256_add_epi32(_sum00_11, _sum02_13);

            _sum04_15 = _mm256_add_epi32(_sum04_15, _sum14_05);
            _sum06_17 = _mm256_add_epi32(_sum06_17, _sum16_07);
            _sum04_15 = _mm256_add_epi32(_sum04_15, _sum06_17);

            __m256i _perm_mask = _mm256_set_epi32(6, 3, 4, 1, 7, 2, 5, 0);
            _sum00_11 = _mm256_permutevar8x32_epi32(_sum00_11, _perm_mask);
            _sum04_15 = _mm256_permutevar8x32_epi32(_sum04_15, _perm_mask);

            int sum[16];
            _mm256_storeu_si256((__m256i*)sum, _sum00_11);
            _mm256_storeu_si256((__m256i*)(sum + 8), _sum04_15);

            outptr0[0] = sum[0];
            outptr1[0] = sum[1];
            outptr2[0] = sum[2];
            outptr3[0] = sum[3];
            outptr0[1] = sum[4];
            outptr1[1] = sum[5];
            outptr2[1] = sum[6];
            outptr3[1] = sum[7];
            outptr0[2] = sum[8];
            outptr1[2] = sum[9];
            outptr2[2] = sum[10];
            outptr3[2] = sum[11];
            outptr0[3] = sum[12];
            outptr1[3] = sum[13];
            outptr2[3] = sum[14];
            outptr3[3] = sum[15];
            outptr0 += 4;
            outptr1 += 4;
            outptr2 += 4;
            outptr3 += 4;
        }
#endif
        for (; i + 1 < size; i += 2)
        {
#if __AVX2__
            const signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2);
#else
            const signed char* tmpptr = tmp.channel(i / 2);
#endif
            const signed char* kptr0 = kernel.channel(p / 4);

            int nn = inch * maxk; // inch always > 0

#if __AVX2__
            __m256i _sum00_11 = _mm256_setzero_si256();
            __m256i _sum10_01 = _mm256_setzero_si256();
            __m256i _sum02_13 = _mm256_setzero_si256();
            __m256i _sum12_03 = _mm256_setzero_si256();
#else
            __m128i _sum00 = _mm_setzero_si128();
            __m128i _sum01 = _mm_setzero_si128();
            __m128i _sum02 = _mm_setzero_si128();
            __m128i _sum03 = _mm_setzero_si128();
            __m128i _sum10 = _mm_setzero_si128();
            __m128i _sum11 = _mm_setzero_si128();
            __m128i _sum12 = _mm_setzero_si128();
            __m128i _sum13 = _mm_setzero_si128();
#endif

            int j = 0;
            for (; j < nn; j++)
            {
#if __AVX2__
                __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                __m256i _val01_16 = _mm256_cvtepi8_epi16(_val01);

                __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr0 + 16));
                __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);
                __m256i _w23_16 = _mm256_cvtepi8_epi16(_w23);

                __m256i _val10_16 = _mm256_permute4x64_epi64(_val01_16, 78);

#if __AVXVNNI__ || __AVX512VNNI__
                _sum00_11 = _mm256_dpwssd_epi32(_sum00_11, _val01_16, _w01_16);
                _sum10_01 = _mm256_dpwssd_epi32(_sum10_01, _val10_16, _w01_16);
                _sum02_13 = _mm256_dpwssd_epi32(_sum02_13, _val01_16, _w23_16);
                _sum12_03 = _mm256_dpwssd_epi32(_sum12_03, _val10_16, _w23_16);
#else
                _sum00_11 = _mm256_add_epi32(_sum00_11, _mm256_madd_epi16(_val01_16, _w01_16));
                _sum10_01 = _mm256_add_epi32(_sum10_01, _mm256_madd_epi16(_val10_16, _w01_16));
                _sum02_13 = _mm256_add_epi32(_sum02_13, _mm256_madd_epi16(_val01_16, _w23_16));
                _sum12_03 = _mm256_add_epi32(_sum12_03, _mm256_madd_epi16(_val10_16, _w23_16));
#endif
#else
                __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                __m128i _extval01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _val01);
                __m128i _val0 = _mm_unpacklo_epi8(_val01, _extval01);
                __m128i _val1 = _mm_unpackhi_epi8(_val01, _extval01);

                __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr0 + 16));
                __m128i _extw01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w01);
                __m128i _extw23 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w23);
                __m128i _w0 = _mm_unpacklo_epi8(_w01, _extw01);
                __m128i _w1 = _mm_unpackhi_epi8(_w01, _extw01);
                __m128i _w2 = _mm_unpacklo_epi8(_w23, _extw23);
                __m128i _w3 = _mm_unpackhi_epi8(_w23, _extw23);

#if __XOP__
                _sum00 = _mm_maddd_epi16(_val0, _w0, _sum00);
                _sum01 = _mm_maddd_epi16(_val0, _w1, _sum01);
                _sum02 = _mm_maddd_epi16(_val0, _w2, _sum02);
                _sum03 = _mm_maddd_epi16(_val0, _w3, _sum03);
                _sum10 = _mm_maddd_epi16(_val1, _w0, _sum10);
                _sum11 = _mm_maddd_epi16(_val1, _w1, _sum11);
                _sum12 = _mm_maddd_epi16(_val1, _w2, _sum12);
                _sum13 = _mm_maddd_epi16(_val1, _w3, _sum13);
#else
                _sum00 = _mm_add_epi32(_mm_madd_epi16(_val0, _w0), _sum00);
                _sum01 = _mm_add_epi32(_mm_madd_epi16(_val0, _w1), _sum01);
                _sum02 = _mm_add_epi32(_mm_madd_epi16(_val0, _w2), _sum02);
                _sum03 = _mm_add_epi32(_mm_madd_epi16(_val0, _w3), _sum03);
                _sum10 = _mm_add_epi32(_mm_madd_epi16(_val1, _w0), _sum10);
                _sum11 = _mm_add_epi32(_mm_madd_epi16(_val1, _w1), _sum11);
                _sum12 = _mm_add_epi32(_mm_madd_epi16(_val1, _w2), _sum12);
                _sum13 = _mm_add_epi32(_mm_madd_epi16(_val1, _w3), _sum13);
#endif
#endif

                tmpptr += 16;
                kptr0 += 32;
            }

#if __AVX2__
            // transpose 4x8
            {
                __m256i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm256_unpacklo_epi32(_sum00_11, _sum10_01);
                _tmp1 = _mm256_unpacklo_epi32(_sum02_13, _sum12_03);
                _tmp2 = _mm256_unpackhi_epi32(_sum00_11, _sum10_01);
                _tmp3 = _mm256_unpackhi_epi32(_sum02_13, _sum12_03);
                _sum00_11 = _mm256_unpacklo_epi64(_tmp0, _tmp1);
                _sum10_01 = _mm256_unpackhi_epi64(_tmp0, _tmp1);
                _sum02_13 = _mm256_unpacklo_epi64(_tmp2, _tmp3);
                _sum12_03 = _mm256_unpackhi_epi64(_tmp2, _tmp3);
            }

            _sum00_11 = _mm256_add_epi32(_sum00_11, _sum10_01);
            _sum02_13 = _mm256_add_epi32(_sum02_13, _sum12_03);
            _sum00_11 = _mm256_add_epi32(_sum00_11, _sum02_13);

            __m256i _perm_mask = _mm256_set_epi32(6, 3, 4, 1, 7, 2, 5, 0);
            _sum00_11 = _mm256_permutevar8x32_epi32(_sum00_11, _perm_mask);

            int sum[8];
            _mm256_storeu_si256((__m256i*)sum, _sum00_11);
#else
            // transpose 4x4
            {
                __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm_unpacklo_epi32(_sum00, _sum01);
                _tmp1 = _mm_unpacklo_epi32(_sum02, _sum03);
                _tmp2 = _mm_unpackhi_epi32(_sum00, _sum01);
                _tmp3 = _mm_unpackhi_epi32(_sum02, _sum03);
                _sum00 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                _sum01 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                _sum02 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                _sum03 = _mm_unpackhi_epi64(_tmp2, _tmp3);
            }
            {
                __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm_unpacklo_epi32(_sum10, _sum11);
                _tmp1 = _mm_unpacklo_epi32(_sum12, _sum13);
                _tmp2 = _mm_unpackhi_epi32(_sum10, _sum11);
                _tmp3 = _mm_unpackhi_epi32(_sum12, _sum13);
                _sum10 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                _sum11 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                _sum12 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                _sum13 = _mm_unpackhi_epi64(_tmp2, _tmp3);
            }

            _sum00 = _mm_add_epi32(_sum00, _sum01);
            _sum02 = _mm_add_epi32(_sum02, _sum03);
            _sum10 = _mm_add_epi32(_sum10, _sum11);
            _sum12 = _mm_add_epi32(_sum12, _sum13);

            _sum00 = _mm_add_epi32(_sum00, _sum02);
            _sum10 = _mm_add_epi32(_sum10, _sum12);

            int sum[8];
            _mm_storeu_si128((__m128i*)sum, _sum00);
            _mm_storeu_si128((__m128i*)(sum + 4), _sum10);
#endif

            outptr0[0] = sum[0];
            outptr1[0] = sum[1];
            outptr2[0] = sum[2];
            outptr3[0] = sum[3];
            outptr0[1] = sum[4];
            outptr1[1] = sum[5];
            outptr2[1] = sum[6];
            outptr3[1] = sum[7];
            outptr0 += 2;
            outptr1 += 2;
            outptr2 += 2;
            outptr3 += 2;
        }
        for (; i < size; i++)
        {
#if __AVX2__
            const signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2 + i % 2);
#else
            const signed char* tmpptr = tmp.channel(i / 2 + i % 2);
#endif
            const signed char* kptr0 = kernel.channel(p / 4);

            int nn = inch * maxk; // inch always > 0

#if __AVX2__
            __m256i _sum0_1 = _mm256_setzero_si256();
            __m256i _sum2_3 = _mm256_setzero_si256();
#else
            __m128i _sum0 = _mm_setzero_si128();
            __m128i _sum1 = _mm_setzero_si128();
            __m128i _sum2 = _mm_setzero_si128();
            __m128i _sum3 = _mm_setzero_si128();
#endif

            int j = 0;
            for (; j < nn; j++)
            {
#if __AVX2__
                __m128i _val = _mm_loadl_epi64((const __m128i*)tmpptr);
                _val = _mm_cvtepi8_epi16(_val);

                __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr0 + 16));
                __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);
                __m256i _w23_16 = _mm256_cvtepi8_epi16(_w23);

                __m256i _valval = _mm256_inserti128_si256(_mm256_castsi128_si256(_val), _val, 1);

#if __AVXVNNI__ || __AVX512VNNI__
                _sum0_1 = _mm256_dpwssd_epi32(_sum0_1, _valval, _w01_16);
                _sum2_3 = _mm256_dpwssd_epi32(_sum2_3, _valval, _w23_16);
#else
                _sum0_1 = _mm256_add_epi32(_sum0_1, _mm256_madd_epi16(_valval, _w01_16));
                _sum2_3 = _mm256_add_epi32(_sum2_3, _mm256_madd_epi16(_valval, _w23_16));
#endif
#else
                __m128i _val = _mm_loadl_epi64((const __m128i*)tmpptr);
#if __SSE4_1__
                _val = _mm_cvtepi8_epi16(_val);
#else
                _val = _mm_unpacklo_epi8(_val, _mm_cmpgt_epi8(_mm_setzero_si128(), _val));
#endif

                __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr0 + 16));
                __m128i _extw01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w01);
                __m128i _extw23 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w23);
                __m128i _w0 = _mm_unpacklo_epi8(_w01, _extw01);
                __m128i _w1 = _mm_unpackhi_epi8(_w01, _extw01);
                __m128i _w2 = _mm_unpacklo_epi8(_w23, _extw23);
                __m128i _w3 = _mm_unpackhi_epi8(_w23, _extw23);

#if __XOP__
                _sum0 = _mm_maddd_epi16(_val, _w0, _sum0);
                _sum1 = _mm_maddd_epi16(_val, _w1, _sum1);
                _sum2 = _mm_maddd_epi16(_val, _w2, _sum2);
                _sum3 = _mm_maddd_epi16(_val, _w3, _sum3);
#else
                _sum0 = _mm_add_epi32(_mm_madd_epi16(_val, _w0), _sum0);
                _sum1 = _mm_add_epi32(_mm_madd_epi16(_val, _w1), _sum1);
                _sum2 = _mm_add_epi32(_mm_madd_epi16(_val, _w2), _sum2);
                _sum3 = _mm_add_epi32(_mm_madd_epi16(_val, _w3), _sum3);
#endif
#endif

                tmpptr += 8;
                kptr0 += 32;
            }

#if __AVX2__
            __m128i _sum0 = _mm256_extracti128_si256(_sum0_1, 0);
            __m128i _sum1 = _mm256_extracti128_si256(_sum0_1, 1);
            __m128i _sum2 = _mm256_extracti128_si256(_sum2_3, 0);
            __m128i _sum3 = _mm256_extracti128_si256(_sum2_3, 1);
#endif

            // transpose 4x4
            {
                __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm_unpacklo_epi32(_sum0, _sum1);
                _tmp1 = _mm_unpacklo_epi32(_sum2, _sum3);
                _tmp2 = _mm_unpackhi_epi32(_sum0, _sum1);
                _tmp3 = _mm_unpackhi_epi32(_sum2, _sum3);
                _sum0 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                _sum1 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                _sum2 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                _sum3 = _mm_unpackhi_epi64(_tmp2, _tmp3);
            }

            _sum0 = _mm_add_epi32(_sum0, _sum1);
            _sum2 = _mm_add_epi32(_sum2, _sum3);

            _sum0 = _mm_add_epi32(_sum0, _sum2);

            int sum[4];
            _mm_storeu_si128((__m128i*)sum, _sum0);

            outptr0[0] = sum[0];
            outptr1[0] = sum[1];
            outptr2[0] = sum[2];
            outptr3[0] = sum[3];
            outptr0 += 1;
            outptr1 += 1;
            outptr2 += 1;
            outptr3 += 1;
        }
    }

    remain_outch_start += nn_outch << 2;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = remain_outch_start; p < outch; p++)
    {
        int* outptr0 = top_blob.channel(p);

        int i = 0;
#if __AVX2__
        for (; i + 3 < size; i += 4)
        {
            const signed char* tmpptr = tmp.channel(i / 4);
            const signed char* kptr0 = kernel.channel(p / 4 + p % 4);

            int nn = inch * maxk; // inch always > 0

            __m256i _sum01 = _mm256_setzero_si256();
            __m256i _sum23 = _mm256_setzero_si256();

            int j = 0;
            for (; j < nn; j++)
            {
                __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                __m128i _val23 = _mm_loadu_si128((const __m128i*)(tmpptr + 16));
                __m256i _val01_16 = _mm256_cvtepi8_epi16(_val01);
                __m256i _val23_16 = _mm256_cvtepi8_epi16(_val23);

                __m128i _w01 = _mm_loadl_epi64((const __m128i*)kptr0);
                __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);
                _w01_16 = _mm256_permute4x64_epi64(_w01_16, _MM_SHUFFLE(1, 0, 1, 0));

#if __AVXVNNI__ || __AVX512VNNI__
                _sum01 = _mm256_dpwssd_epi32(_sum01, _val01_16, _w01_16);
                _sum23 = _mm256_dpwssd_epi32(_sum23, _val23_16, _w01_16);
#else
                _sum01 = _mm256_add_epi32(_sum01, _mm256_madd_epi16(_val01_16, _w01_16));
                _sum23 = _mm256_add_epi32(_sum23, _mm256_madd_epi16(_val23_16, _w01_16));
#endif

                tmpptr += 32;
                kptr0 += 8;
            }

            __m128i _sum0 = _mm256_extracti128_si256(_sum01, 0);
            __m128i _sum1 = _mm256_extracti128_si256(_sum01, 1);
            __m128i _sum2 = _mm256_extracti128_si256(_sum23, 0);
            __m128i _sum3 = _mm256_extracti128_si256(_sum23, 1);

            outptr0[0] = _mm_reduce_add_epi32(_sum0);
            outptr0[1] = _mm_reduce_add_epi32(_sum1);
            outptr0[2] = _mm_reduce_add_epi32(_sum2);
            outptr0[3] = _mm_reduce_add_epi32(_sum3);
            outptr0 += 4;
        }
#endif
        for (; i + 1 < size; i += 2)
        {
#if __AVX2__
            const signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2);
#else
            const signed char* tmpptr = tmp.channel(i / 2);
#endif
            const signed char* kptr0 = kernel.channel(p / 4 + p % 4);

            int nn = inch * maxk; // inch always > 0

#if __AVX2__
            __m256i _sum01 = _mm256_setzero_si256();
#else
            __m128i _sum0 = _mm_setzero_si128();
            __m128i _sum1 = _mm_setzero_si128();
#endif

            int j = 0;
            for (; j < nn; j++)
            {
#if __AVX2__
                __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                __m256i _val01_16 = _mm256_cvtepi8_epi16(_val01);

                __m128i _w01 = _mm_loadl_epi64((const __m128i*)kptr0);
                __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);
                _w01_16 = _mm256_permute4x64_epi64(_w01_16, _MM_SHUFFLE(1, 0, 1, 0));

#if __AVXVNNI__ || __AVX512VNNI__
                _sum01 = _mm256_dpwssd_epi32(_sum01, _val01_16, _w01_16);
#else
                _sum01 = _mm256_add_epi32(_sum01, _mm256_madd_epi16(_val01_16, _w01_16));
#endif
#else
                __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                __m128i _extval01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _val01);
                __m128i _val0 = _mm_unpacklo_epi8(_val01, _extval01);
                __m128i _val1 = _mm_unpackhi_epi8(_val01, _extval01);

                __m128i _w01 = _mm_loadl_epi64((const __m128i*)kptr0);
#if __SSE4_1__
                __m128i _w0 = _mm_cvtepi8_epi16(_w01);
#else
                __m128i _extw01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w01);
                __m128i _w0 = _mm_unpacklo_epi8(_w01, _extw01);
#endif

#if __XOP__
                _sum0 = _mm_maddd_epi16(_val0, _w0, _sum0);
                _sum1 = _mm_maddd_epi16(_val1, _w0, _sum1);
#else
                _sum0 = _mm_add_epi32(_mm_madd_epi16(_val0, _w0), _sum0);
                _sum1 = _mm_add_epi32(_mm_madd_epi16(_val1, _w0), _sum1);
#endif
#endif

                tmpptr += 16;
                kptr0 += 8;
            }

#if __AVX2__
            __m128i _sum0 = _mm256_extracti128_si256(_sum01, 0);
            __m128i _sum1 = _mm256_extracti128_si256(_sum01, 1);
#endif

            outptr0[0] = _mm_reduce_add_epi32(_sum0);
            outptr0[1] = _mm_reduce_add_epi32(_sum1);
            outptr0 += 2;
        }
        for (; i < size; i++)
        {
#if __AVX2__
            const signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2 + i % 2);
#else
            const signed char* tmpptr = tmp.channel(i / 2 + i % 2);
#endif
            const signed char* kptr0 = kernel.channel(p / 4 + p % 4);

            int nn = inch * maxk; // inch always > 0

            __m128i _sum0 = _mm_setzero_si128();

            int j = 0;
            for (; j < nn; j++)
            {
                __m128i _val01 = _mm_loadl_epi64((const __m128i*)tmpptr);
#if __SSE4_1__
                __m128i _val0 = _mm_cvtepi8_epi16(_val01);
#else
                __m128i _extval01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _val01);
                __m128i _val0 = _mm_unpacklo_epi8(_val01, _extval01);
#endif

                __m128i _w01 = _mm_loadl_epi64((const __m128i*)kptr0);
#if __SSE4_1__
                __m128i _w0 = _mm_cvtepi8_epi16(_w01);
#else
                __m128i _extw01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w01);
                __m128i _w0 = _mm_unpacklo_epi8(_w01, _extw01);
#endif

#if __XOP__
                _sum0 = _mm_maddd_epi16(_val0, _w0, _sum0);
#else
                _sum0 = _mm_add_epi32(_mm_madd_epi16(_val0, _w0), _sum0);
#endif

                tmpptr += 8;
                kptr0 += 8;
            }

            outptr0[0] = _mm_reduce_add_epi32(_sum0);
            outptr0 += 1;
        }
    }
}